

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_vertical_14_sse2
               (uint16_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  longlong lVar29;
  longlong lVar30;
  longlong lVar31;
  longlong lVar32;
  longlong lVar33;
  longlong lVar34;
  longlong lVar35;
  longlong lVar36;
  longlong lVar37;
  longlong lVar38;
  longlong lVar39;
  longlong lVar40;
  longlong lVar41;
  longlong lVar42;
  longlong lVar43;
  longlong lVar44;
  longlong lVar45;
  longlong lVar46;
  longlong lVar47;
  longlong lVar48;
  longlong lVar49;
  longlong lVar50;
  longlong lVar51;
  longlong lVar52;
  longlong lVar53;
  longlong lVar54;
  longlong lVar55;
  longlong lVar56;
  longlong lVar57;
  longlong lVar58;
  longlong lVar59;
  longlong lVar60;
  longlong lVar61;
  longlong lVar62;
  longlong lVar63;
  longlong lVar64;
  longlong lVar65;
  longlong lVar66;
  longlong lVar67;
  longlong lVar68;
  longlong lVar69;
  longlong lVar70;
  longlong lVar71;
  longlong lVar72;
  longlong lVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined4 uVar86;
  ulong uVar87;
  longlong lVar88;
  longlong lVar89;
  longlong lVar90;
  longlong lVar91;
  longlong lVar92;
  longlong lVar93;
  longlong lVar94;
  longlong lVar95;
  longlong lVar96;
  longlong lVar97;
  longlong lVar98;
  longlong lVar99;
  longlong lVar100;
  longlong lVar101;
  longlong lVar102;
  longlong lVar103;
  longlong lVar104;
  longlong lVar105;
  longlong lVar106;
  longlong lVar107;
  longlong lVar108;
  longlong lVar109;
  longlong lVar110;
  longlong lVar111;
  longlong lVar112;
  longlong lVar113;
  longlong lVar114;
  longlong lVar115;
  longlong lVar116;
  longlong lVar117;
  longlong lVar118;
  longlong lVar119;
  longlong lVar120;
  longlong lVar121;
  longlong lVar122;
  longlong lVar123;
  longlong lVar124;
  longlong lVar125;
  longlong lVar126;
  longlong lVar127;
  longlong lVar128;
  longlong lVar129;
  longlong lVar130;
  longlong lVar131;
  longlong lVar132;
  longlong lVar133;
  longlong lVar134;
  longlong lVar135;
  longlong lVar136;
  longlong lVar137;
  longlong lVar138;
  longlong lVar139;
  longlong lVar140;
  longlong lVar141;
  longlong lVar142;
  longlong lVar143;
  longlong lVar144;
  longlong lVar145;
  longlong lVar146;
  longlong lVar147;
  ulong uVar148;
  uint *puVar149;
  longlong *plVar150;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  longlong *in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  short sVar151;
  short sVar157;
  short sVar158;
  short sVar159;
  short sVar160;
  short sVar161;
  short sVar162;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  short sVar163;
  __m128i d7_2;
  __m128i d3_2;
  __m128i d2_2;
  __m128i d1_2;
  __m128i d0_2;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i p3_2;
  __m128i p4_2;
  __m128i p5_2;
  __m128i p6_2;
  __m128i p3;
  __m128i p4;
  __m128i p5;
  __m128i p6;
  __m128i pq [7];
  __m128i p [7];
  __m128i q [7];
  int flat2_mask;
  __m128i sum_q;
  __m128i sum_lq;
  __m128i sum_lp;
  __m128i sum_p;
  __m128i sum_p_0;
  __m128i work0_1;
  __m128i work0_0;
  __m128i work0;
  __m128i four;
  __m128i eight;
  __m128i sum_p3;
  __m128i sum_p6;
  __m128i flat2_pq [6];
  __m128i flat2_q [6];
  __m128i flat2_p [6];
  __m128i flat_pq [3];
  __m128i flat_q [3];
  __m128i flat_p [3];
  __m128i flat2;
  __m128i flat;
  __m128i qs0qs1;
  __m128i ps0ps1;
  __m128i abs_p1p0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i hevhev;
  __m128i mask;
  __m128i t80;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i zero;
  int i;
  __m128i filter1filt;
  __m128i filter2filt;
  __m128i filter2filter1;
  __m128i filt;
  __m128i work;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i t3t4;
  __m128i pmin;
  __m128i pmax;
  __m128i one;
  __m128i zero_1;
  ulong *puVar164;
  __m128i *palVar165;
  __m128i *x3;
  __m128i *x2;
  undefined4 in_stack_ffffffffffffe428;
  undefined2 in_stack_ffffffffffffe42c;
  undefined2 in_stack_ffffffffffffe42e;
  __m128i *in_stack_ffffffffffffe430;
  __m128i *palVar166;
  __m128i *p1p0_00;
  __m128i *in_stack_ffffffffffffe440;
  ulong *puVar167;
  __m128i *in_stack_ffffffffffffe448;
  __m128i *palVar168;
  undefined6 in_stack_ffffffffffffe450;
  undefined2 in_stack_ffffffffffffe456;
  __m128i *in_stack_ffffffffffffe460;
  __m128i *in_stack_ffffffffffffe468;
  longlong local_1b88;
  longlong lStack_1b80;
  longlong local_1b78;
  longlong lStack_1b70;
  longlong local_1b68;
  longlong lStack_1b60;
  longlong local_1b58;
  longlong lStack_1b50;
  longlong local_1b48;
  longlong lStack_1b40;
  longlong local_1b38;
  longlong lStack_1b30;
  longlong local_1b28;
  longlong lStack_1b20;
  longlong local_1b18;
  longlong lStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  longlong local_1ad8;
  longlong lStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  longlong local_1a98;
  longlong lStack_1a90;
  longlong local_1a88;
  longlong lStack_1a80;
  longlong local_1a78;
  longlong lStack_1a70;
  longlong local_1a68;
  longlong lStack_1a60;
  longlong local_1a58;
  longlong lStack_1a50;
  longlong local_1a48;
  longlong lStack_1a40;
  longlong local_1a38;
  longlong lStack_1a30;
  longlong local_1a18 [2];
  longlong local_1a08 [2];
  longlong local_19f8 [2];
  longlong local_19e8 [6];
  longlong local_19b8 [2];
  longlong local_19a8 [3];
  undefined8 uStack_1990;
  longlong local_1988 [3];
  undefined8 uStack_1970;
  longlong local_1968 [3];
  undefined8 uStack_1950;
  longlong local_1948 [3];
  uint local_192c;
  uint8_t *local_1928;
  uint8_t *local_1920;
  uint8_t *local_1918;
  int local_190c;
  longlong *local_1908;
  uint local_18fc;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  short local_18d8;
  short sStack_18d6;
  short sStack_18d4;
  short sStack_18d2;
  short sStack_18d0;
  short sStack_18ce;
  short sStack_18cc;
  short sStack_18ca;
  short local_18c8;
  short sStack_18c6;
  short sStack_18c4;
  short sStack_18c2;
  short sStack_18c0;
  short sStack_18be;
  short sStack_18bc;
  short sStack_18ba;
  short local_18b8;
  short sStack_18b6;
  short sStack_18b4;
  short sStack_18b2;
  short sStack_18b0;
  short sStack_18ae;
  short sStack_18ac;
  short sStack_18aa;
  short local_18a8;
  short sStack_18a6;
  short sStack_18a4;
  short sStack_18a2;
  short sStack_18a0;
  short sStack_189e;
  short sStack_189c;
  short sStack_189a;
  short local_1898;
  short sStack_1896;
  short sStack_1894;
  short sStack_1892;
  short sStack_1890;
  short sStack_188e;
  short sStack_188c;
  short sStack_188a;
  short local_1888;
  short sStack_1886;
  short sStack_1884;
  short sStack_1882;
  short sStack_1880;
  short sStack_187e;
  short sStack_187c;
  short sStack_187a;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  short local_1858;
  short sStack_1856;
  short sStack_1854;
  short sStack_1852;
  short sStack_1850;
  short sStack_184e;
  short sStack_184c;
  short sStack_184a;
  short local_1848;
  short sStack_1846;
  short sStack_1844;
  short sStack_1842;
  short sStack_1840;
  short sStack_183e;
  short sStack_183c;
  short sStack_183a;
  undefined8 local_1838;
  undefined8 uStack_1830;
  ushort local_1828;
  ushort uStack_1826;
  ushort uStack_1824;
  ushort uStack_1822;
  ushort uStack_1820;
  ushort uStack_181e;
  ushort uStack_181c;
  ushort uStack_181a;
  ushort local_1818;
  ushort uStack_1816;
  ushort uStack_1814;
  ushort uStack_1812;
  ushort uStack_1810;
  ushort uStack_180e;
  ushort uStack_180c;
  ushort uStack_180a;
  ushort local_1808;
  ushort uStack_1806;
  ushort uStack_1804;
  ushort uStack_1802;
  ushort uStack_1800;
  ushort uStack_17fe;
  ushort uStack_17fc;
  ushort uStack_17fa;
  ushort local_17f8;
  ushort uStack_17f6;
  ushort uStack_17f4;
  ushort uStack_17f2;
  ushort uStack_17f0;
  ushort uStack_17ee;
  ushort uStack_17ec;
  ushort uStack_17ea;
  ushort local_17e8;
  ushort uStack_17e6;
  ushort uStack_17e4;
  ushort uStack_17e2;
  ushort uStack_17e0;
  ushort uStack_17de;
  ushort uStack_17dc;
  ushort uStack_17da;
  ushort local_17d8;
  ushort uStack_17d6;
  ushort uStack_17d4;
  ushort uStack_17d2;
  short sStack_17d0;
  short sStack_17ce;
  short sStack_17cc;
  short sStack_17ca;
  ushort local_17c8;
  ushort uStack_17c6;
  ushort uStack_17c4;
  ushort uStack_17c2;
  short sStack_17c0;
  short sStack_17be;
  short sStack_17bc;
  short sStack_17ba;
  ushort local_17b8;
  ushort uStack_17b6;
  ushort uStack_17b4;
  ushort uStack_17b2;
  short sStack_17b0;
  short sStack_17ae;
  short sStack_17ac;
  short sStack_17aa;
  ushort local_17a8;
  ushort uStack_17a6;
  ushort uStack_17a4;
  ushort uStack_17a2;
  short sStack_17a0;
  short sStack_179e;
  short sStack_179c;
  short sStack_179a;
  ushort local_1798;
  ushort uStack_1796;
  ushort uStack_1794;
  ushort uStack_1792;
  short sStack_1790;
  short sStack_178e;
  short sStack_178c;
  short sStack_178a;
  ushort local_1788;
  ushort uStack_1786;
  ushort uStack_1784;
  ushort uStack_1782;
  short sStack_1780;
  short sStack_177e;
  short sStack_177c;
  short sStack_177a;
  ushort local_1778;
  ushort uStack_1776;
  ushort uStack_1774;
  ushort uStack_1772;
  short sStack_1770;
  short sStack_176e;
  short sStack_176c;
  short sStack_176a;
  ushort local_1768;
  ushort uStack_1766;
  ushort uStack_1764;
  ushort uStack_1762;
  short sStack_1760;
  short sStack_175e;
  short sStack_175c;
  short sStack_175a;
  ushort local_1758;
  ushort uStack_1756;
  ushort uStack_1754;
  ushort uStack_1752;
  short sStack_1750;
  short sStack_174e;
  short sStack_174c;
  short sStack_174a;
  ushort local_1748;
  ushort uStack_1746;
  ushort uStack_1744;
  ushort uStack_1742;
  short sStack_1740;
  short sStack_173e;
  short sStack_173c;
  short sStack_173a;
  ushort local_1738;
  ushort uStack_1736;
  ushort uStack_1734;
  ushort uStack_1732;
  undefined2 in_stack_ffffffffffffe8d0;
  undefined2 in_stack_ffffffffffffe8d2;
  undefined2 in_stack_ffffffffffffe8d4;
  undefined2 in_stack_ffffffffffffe8d6;
  undefined2 in_stack_ffffffffffffe8d8;
  undefined2 in_stack_ffffffffffffe8da;
  undefined2 in_stack_ffffffffffffe8dc;
  undefined2 in_stack_ffffffffffffe8de;
  undefined2 in_stack_ffffffffffffe8e0;
  undefined2 in_stack_ffffffffffffe8e2;
  undefined2 in_stack_ffffffffffffe8e4;
  undefined2 in_stack_ffffffffffffe8e6;
  undefined2 in_stack_ffffffffffffe8e8;
  undefined2 in_stack_ffffffffffffe8ea;
  undefined2 in_stack_ffffffffffffe8ec;
  undefined2 in_stack_ffffffffffffe8ee;
  undefined8 uStack_1710;
  ushort local_1708;
  ushort uStack_1706;
  ushort uStack_1704;
  ushort uStack_1702;
  ushort uStack_1700;
  ushort uStack_16fe;
  ushort uStack_16fc;
  ushort uStack_16fa;
  ushort local_16f8;
  ushort uStack_16f6;
  ushort uStack_16f4;
  ushort uStack_16f2;
  ushort uStack_16f0;
  ushort uStack_16ee;
  ushort uStack_16ec;
  ushort uStack_16ea;
  ushort local_16e8;
  ushort uStack_16e6;
  ushort uStack_16e4;
  ushort uStack_16e2;
  short sStack_16e0;
  short sStack_16de;
  short sStack_16dc;
  short sStack_16da;
  ushort local_16d8;
  ushort uStack_16d6;
  ushort uStack_16d4;
  ushort uStack_16d2;
  short sStack_16d0;
  short sStack_16ce;
  short sStack_16cc;
  short sStack_16ca;
  ushort local_16c8;
  ushort uStack_16c6;
  ushort uStack_16c4;
  ushort uStack_16c2;
  short sStack_16c0;
  short sStack_16be;
  short sStack_16bc;
  short sStack_16ba;
  short local_16b8;
  short sStack_16b6;
  short sStack_16b4;
  short sStack_16b2;
  short sStack_16b0;
  short sStack_16ae;
  short sStack_16ac;
  short sStack_16aa;
  ushort local_16a8;
  ushort uStack_16a6;
  ushort uStack_16a4;
  ushort uStack_16a2;
  short sStack_16a0;
  short sStack_169e;
  short sStack_169c;
  short sStack_169a;
  ushort local_1698;
  ushort uStack_1696;
  ushort uStack_1694;
  ushort uStack_1692;
  short sStack_1690;
  short sStack_168e;
  short sStack_168c;
  short sStack_168a;
  ulong local_1688;
  ulong uStack_1680;
  ulong local_1678;
  ulong uStack_1670;
  longlong local_1668;
  undefined4 uStack_165c;
  undefined4 local_1658;
  undefined4 uStack_1654;
  undefined4 uStack_164c;
  undefined4 local_1648;
  longlong local_1638 [2];
  longlong local_1628 [2];
  ulong local_1618 [2];
  ulong local_1608;
  ulong uStack_1600;
  longlong local_15f8;
  longlong lStack_15f0;
  longlong local_15e8 [2];
  longlong local_15d8 [2];
  longlong local_15c8 [2];
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  int local_15a0;
  uint local_159c;
  uint8_t *local_1598;
  uint8_t *local_1590;
  uint8_t *local_1588;
  longlong *local_1580;
  __m128i *local_1578;
  __m128i *local_1570;
  undefined8 *local_1468;
  undefined8 *local_1460;
  undefined8 *local_1458;
  longlong *local_1450;
  undefined8 *local_1448;
  undefined8 *local_1440;
  undefined8 *local_1438;
  longlong *local_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  longlong local_1418;
  longlong lStack_1410;
  longlong local_1408;
  longlong lStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  longlong local_1338;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  longlong local_12b8;
  ulong local_1298;
  ulong uStack_1290;
  ulong local_1288;
  ulong uStack_1280;
  ulong local_1278;
  ulong uStack_1270;
  ulong local_1268;
  ulong uStack_1260;
  undefined8 local_1258;
  ulong uStack_1250;
  undefined8 local_1248;
  undefined4 uStack_1240;
  undefined4 uStack_123c;
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  uint local_1194;
  longlong *local_1190;
  undefined4 *local_1188;
  longlong *local_1180;
  __m128i *local_1178;
  ulong *local_1170;
  __m128i *local_1168;
  __m128i *local_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  ulong local_1148;
  ulong uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  ulong local_1108;
  ulong uStack_1100;
  ulong local_10f8;
  ulong uStack_10f0;
  ulong local_10e8;
  ulong uStack_10e0;
  ulong local_10d8;
  ulong uStack_10d0;
  ulong local_10c8;
  ulong uStack_10c0;
  ulong local_10b8;
  undefined8 uStack_10b0;
  ulong local_10a8;
  ulong uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  ulong local_1068;
  ulong uStack_1060;
  ulong local_1058;
  ulong uStack_1050;
  ulong local_1048;
  ulong uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  short local_1028;
  short sStack_1026;
  short sStack_1024;
  short sStack_1022;
  short sStack_1020;
  short sStack_101e;
  short sStack_101c;
  ushort uStack_101a;
  short local_1018;
  short sStack_1016;
  short sStack_1014;
  short sStack_1012;
  short sStack_1010;
  short sStack_100e;
  short sStack_100c;
  ushort uStack_100a;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  ulong uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  ulong uStack_fd0;
  undefined2 local_fbe;
  undefined2 local_fbc;
  undefined2 local_fba;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  short local_f78;
  short sStack_f76;
  short sStack_f74;
  short sStack_f72;
  short sStack_f70;
  short sStack_f6e;
  short sStack_f6c;
  short sStack_f6a;
  undefined8 local_f68;
  undefined8 uStack_f60;
  short local_f58;
  short sStack_f56;
  short sStack_f54;
  short sStack_f52;
  short sStack_f50;
  short sStack_f4e;
  short sStack_f4c;
  short sStack_f4a;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  short local_eb8;
  short sStack_eb6;
  short sStack_eb4;
  short sStack_eb2;
  short sStack_eb0;
  short sStack_eae;
  short sStack_eac;
  short sStack_eaa;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  short local_e98;
  short sStack_e96;
  short sStack_e94;
  short sStack_e92;
  short sStack_e90;
  short sStack_e8e;
  short sStack_e8c;
  short sStack_e8a;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  short local_df8;
  short sStack_df6;
  short sStack_df4;
  short sStack_df2;
  short sStack_df0;
  short sStack_dee;
  short sStack_dec;
  short sStack_dea;
  undefined8 local_de8;
  undefined8 uStack_de0;
  short local_dd8;
  short sStack_dd6;
  short sStack_dd4;
  short sStack_dd2;
  short sStack_dd0;
  short sStack_dce;
  short sStack_dcc;
  short sStack_dca;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  short local_d38;
  short sStack_d36;
  short sStack_d34;
  short sStack_d32;
  short sStack_d30;
  short sStack_d2e;
  short sStack_d2c;
  short sStack_d2a;
  undefined8 local_d28;
  undefined8 uStack_d20;
  short local_d18;
  short sStack_d16;
  short sStack_d14;
  short sStack_d12;
  short sStack_d10;
  short sStack_d0e;
  short sStack_d0c;
  short sStack_d0a;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  short local_c78;
  short sStack_c76;
  short sStack_c74;
  short sStack_c72;
  short sStack_c70;
  short sStack_c6e;
  short sStack_c6c;
  short sStack_c6a;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  short local_c38;
  short sStack_c36;
  short sStack_c34;
  short sStack_c32;
  short sStack_c30;
  short sStack_c2e;
  short sStack_c2c;
  short sStack_c2a;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  short local_b18;
  short sStack_b16;
  short sStack_b14;
  short sStack_b12;
  short sStack_b10;
  short sStack_b0e;
  short sStack_b0c;
  short sStack_b0a;
  undefined8 local_b08;
  undefined8 uStack_b00;
  short local_af8;
  short sStack_af6;
  short sStack_af4;
  short sStack_af2;
  short sStack_af0;
  short sStack_aee;
  short sStack_aec;
  short sStack_aea;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  short local_aa8;
  short sStack_aa6;
  short sStack_aa4;
  short sStack_aa2;
  short sStack_aa0;
  short sStack_a9e;
  short sStack_a9c;
  short sStack_a9a;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  longlong local_a78;
  longlong lStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  longlong local_a58;
  longlong lStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  short local_a38;
  short sStack_a36;
  short sStack_a34;
  short sStack_a32;
  short sStack_a30;
  short sStack_a2e;
  short sStack_a2c;
  short sStack_a2a;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  short local_9f8;
  short sStack_9f6;
  short sStack_9f4;
  short sStack_9f2;
  short sStack_9f0;
  short sStack_9ee;
  short sStack_9ec;
  short sStack_9ea;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  short local_9b8;
  short sStack_9b6;
  short sStack_9b4;
  short sStack_9b2;
  short sStack_9b0;
  short sStack_9ae;
  short sStack_9ac;
  short sStack_9aa;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  short local_978;
  short sStack_976;
  short sStack_974;
  short sStack_972;
  short sStack_970;
  short sStack_96e;
  short sStack_96c;
  short sStack_96a;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  short local_918;
  short sStack_916;
  short sStack_914;
  short sStack_912;
  short sStack_910;
  short sStack_90e;
  short sStack_90c;
  short sStack_90a;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  short local_8d8;
  short sStack_8d6;
  short sStack_8d4;
  short sStack_8d2;
  short sStack_8d0;
  short sStack_8ce;
  short sStack_8cc;
  short sStack_8ca;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined4 local_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined4 local_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined4 local_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined4 local_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined4 local_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined4 local_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined4 local_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined4 local_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined4 local_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  longlong local_598;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  longlong local_578;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  ulong local_558;
  ulong uStack_550;
  ulong local_548;
  ulong uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  ulong local_4f8;
  ulong uStack_4f0;
  ulong local_4e8;
  ulong uStack_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  uint local_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  ulong uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  ulong uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  ulong uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  ulong uStack_430;
  ulong local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  longlong local_3e8;
  longlong lStack_3e0;
  longlong local_3c8;
  longlong lStack_3c0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_388 [16];
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  undefined8 local_358;
  undefined8 uStack_350;
  undefined2 local_348;
  undefined2 local_346;
  undefined2 local_344;
  undefined2 local_342;
  undefined2 local_340;
  undefined2 local_33e;
  undefined2 local_33c;
  undefined2 local_33a;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined2 local_328;
  undefined2 local_326;
  undefined2 local_324;
  undefined2 local_322;
  undefined2 local_320;
  undefined2 local_31e;
  undefined2 local_31c;
  undefined2 local_31a;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined2 local_308;
  undefined2 local_306;
  undefined2 local_304;
  undefined2 local_302;
  undefined2 local_300;
  undefined2 local_2fe;
  undefined2 local_2fc;
  undefined2 local_2fa;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined2 local_2e0;
  undefined2 local_2de;
  undefined2 local_2dc;
  undefined2 local_2da;
  undefined2 local_2d8;
  undefined2 local_2d6;
  undefined2 local_2d4;
  undefined2 local_2d2;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  ulong uStack_100;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_1430 = in_RDI + -2;
  local_1a98 = *local_1430;
  lStack_1a90 = in_RDI[-1];
  local_1438 = (undefined8 *)((long)in_RDI + (long)in_ESI * 2 + -0x10);
  local_1aa8 = *local_1438;
  uStack_1aa0 = local_1438[1];
  local_1440 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * 2 + -0x10);
  local_1ab8 = *local_1440;
  uStack_1ab0 = local_1440[1];
  local_1448 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) * 2 + -0x10);
  local_1ac8 = *local_1448;
  uStack_1ac0 = local_1448[1];
  palVar165 = &local_1a18;
  local_192c = in_R9D;
  local_1928 = in_R8;
  local_1920 = in_RCX;
  local_1918 = in_RDX;
  local_190c = in_ESI;
  local_1908 = in_RDI;
  highbd_transpose4x8_8x4_sse2
            (in_stack_ffffffffffffe430,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe42e,
                      CONCAT24(in_stack_ffffffffffffe42c,in_stack_ffffffffffffe428)),palVar165,
             &local_1a08,&local_19f8,(__m128i *)local_19e8,in_stack_ffffffffffffe440,
             in_stack_ffffffffffffe448,
             (__m128i *)CONCAT26(in_stack_ffffffffffffe456,in_stack_ffffffffffffe450),palVar165,
             in_stack_ffffffffffffe460,in_stack_ffffffffffffe468);
  local_1450 = local_1908;
  local_1ad8 = *local_1908;
  lStack_1ad0 = local_1908[1];
  local_1458 = (undefined8 *)((long)local_1908 + (long)local_190c * 2);
  local_1ae8 = *local_1458;
  uStack_1ae0 = local_1458[1];
  local_1460 = (undefined8 *)((long)local_1908 + (long)(local_190c * 2) * 2);
  local_1af8 = *local_1460;
  uStack_1af0 = local_1460[1];
  local_1468 = (undefined8 *)((long)local_1908 + (long)(local_190c * 3) * 2);
  local_1b08 = *local_1468;
  uStack_1b00 = local_1468[1];
  x3 = (__m128i *)local_1948;
  x2 = (__m128i *)&stack0xffffffffffffe468;
  palVar166 = (__m128i *)local_19a8;
  highbd_transpose4x8_8x4_sse2
            (in_stack_ffffffffffffe430,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe42e,
                      CONCAT24(in_stack_ffffffffffffe42c,in_stack_ffffffffffffe428)),x2,x3,
             (__m128i *)(local_1968 + 2),(__m128i *)local_1968,in_stack_ffffffffffffe440,
             in_stack_ffffffffffffe448,
             (__m128i *)CONCAT26(in_stack_ffffffffffffe456,in_stack_ffffffffffffe450),palVar165,
             palVar166,in_stack_ffffffffffffe468);
  local_1580 = &local_1a88;
  local_1588 = local_1918;
  local_1590 = local_1920;
  local_1598 = local_1928;
  local_159c = local_192c;
  local_1428 = 0;
  uStack_1420 = 0;
  local_15b8 = 0;
  uStack_15b0 = 0;
  local_1578 = palVar166;
  local_1570 = palVar165;
  get_limit(local_1918,local_1920,local_1928,local_192c,&local_15c8,&local_15d8,&local_15e8,
            (__m128i *)&local_15f8);
  for (local_15a0 = 0; local_15a0 < 7; local_15a0 = local_15a0 + 1) {
    lVar1 = local_1570[local_15a0][0];
    lVar2 = local_1570[local_15a0][1];
    lVar3 = local_1578[local_15a0][0];
    lVar4 = local_1578[local_15a0][1];
    local_1580[(long)local_15a0 * 2] = lVar1;
    (local_1580 + (long)local_15a0 * 2)[1] = lVar3;
    local_1418 = lVar3;
    lStack_1410 = lVar4;
    local_1408 = lVar1;
    lStack_1400 = lVar2;
  }
  palVar165 = (__m128i *)&local_1608;
  puVar164 = local_1618;
  palVar166 = &local_1628;
  p1p0_00 = &local_1638;
  puVar167 = puVar164;
  palVar168 = palVar165;
  highbd_hev_filter_mask_x_sse2
            (palVar165,(int)((ulong)puVar164 >> 0x20),p1p0_00,palVar166,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe42e,
                      CONCAT24(in_stack_ffffffffffffe42c,in_stack_ffffffffffffe428)),x2,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe8d6,
                      CONCAT24(in_stack_ffffffffffffe8d4,
                               CONCAT22(in_stack_ffffffffffffe8d2,in_stack_ffffffffffffe8d0))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe8de,
                      CONCAT24(in_stack_ffffffffffffe8dc,
                               CONCAT22(in_stack_ffffffffffffe8da,in_stack_ffffffffffffe8d8))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe8e6,
                      CONCAT24(in_stack_ffffffffffffe8e4,
                               CONCAT22(in_stack_ffffffffffffe8e2,in_stack_ffffffffffffe8e0))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe8ee,
                      CONCAT24(in_stack_ffffffffffffe8ec,
                               CONCAT22(in_stack_ffffffffffffe8ea,in_stack_ffffffffffffe8e8))));
  local_1180 = &local_1668;
  local_1188 = &local_1658;
  local_1190 = &local_15f8;
  local_1194 = local_159c;
  local_1158 = 0;
  uStack_1150 = 0;
  local_11a8 = 0;
  uStack_11a0 = 0;
  local_fbe = 1;
  local_2fa = 1;
  local_2fc = 1;
  local_2fe = 1;
  local_300 = 1;
  local_302 = 1;
  local_304 = 1;
  local_306 = 1;
  local_308 = 1;
  local_11b8 = 0x1000100010001;
  uStack_11b0 = 0x1000100010001;
  local_4ac = local_159c;
  auVar152._8_8_ = 0x1000100010001;
  auVar152._0_8_ = 0x1000100010001;
  local_368 = psllw(auVar152,ZEXT416(local_159c));
  auVar153._8_8_ = 0x1000100010001;
  auVar153._0_8_ = 0x1000100010001;
  local_388 = psubsw(local_368,auVar153);
  auVar80._8_8_ = lStack_15f0;
  auVar80._0_8_ = local_15f8;
  local_11c8 = psubsw(local_388,auVar80);
  auVar81._8_8_ = lStack_15f0;
  auVar81._0_8_ = local_15f8;
  local_3a8 = 0;
  uStack_3a0 = 0;
  auVar152 = psubsw(ZEXT816(0),auVar81);
  local_2d2 = 3;
  local_2d4 = 3;
  local_2d6 = 3;
  local_2d8 = 3;
  local_2da = 4;
  local_2dc = 4;
  local_2de = 4;
  local_2e0 = 4;
  local_11e8 = 0x4000400040004;
  uStack_11e0 = 0x3000300030003;
  local_3c8 = (*palVar166)[0];
  lStack_3c0 = (*palVar166)[1];
  auVar82._8_8_ = lStack_15f0;
  auVar82._0_8_ = local_15f8;
  auVar153 = psubsw((undefined1  [16])*palVar166,auVar82);
  local_3e8 = (*p1p0_00)[0];
  lStack_3e0 = (*p1p0_00)[1];
  auVar83._8_8_ = lStack_15f0;
  auVar83._0_8_ = local_15f8;
  auVar154 = psubsw((undefined1  [16])*p1p0_00,auVar83);
  local_11f8._0_8_ = auVar153._0_8_;
  local_11f8._8_8_ = auVar153._8_8_;
  local_1208._0_8_ = auVar154._0_8_;
  local_1208._8_8_ = auVar154._8_8_;
  local_408 = local_11f8._0_8_;
  uStack_400 = local_11f8._8_8_;
  local_418 = local_1208._0_8_;
  uStack_410 = local_1208._8_8_;
  local_1218 = psubsw(auVar153,auVar154);
  local_2c0 = local_11d8;
  local_2c8 = local_11c8;
  local_1d0 = local_1218;
  uVar5 = local_1218._0_8_;
  uVar6 = local_1218._8_8_;
  local_a8._0_2_ = local_1218._0_2_;
  local_a8._2_2_ = local_1218._2_2_;
  local_a8._4_2_ = local_1218._4_2_;
  local_a8._6_2_ = local_1218._6_2_;
  uStack_a0._0_2_ = local_1218._8_2_;
  uStack_a0._2_2_ = local_1218._10_2_;
  uStack_a0._4_2_ = local_1218._12_2_;
  uStack_a0._6_2_ = local_1218._14_2_;
  local_b8._0_2_ = local_11c8._0_2_;
  local_b8._2_2_ = local_11c8._2_2_;
  local_b8._4_2_ = local_11c8._4_2_;
  local_b8._6_2_ = local_11c8._6_2_;
  uStack_b0._0_2_ = local_11c8._8_2_;
  uStack_b0._2_2_ = local_11c8._10_2_;
  uStack_b0._4_2_ = local_11c8._12_2_;
  uStack_b0._6_2_ = local_11c8._14_2_;
  local_1218._0_2_ =
       (ushort)((short)local_b8 < (short)local_a8) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_a8) * (short)local_a8;
  local_1218._2_2_ =
       (ushort)(local_b8._2_2_ < local_a8._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_a8._2_2_) * local_a8._2_2_;
  local_1218._4_2_ =
       (ushort)(local_b8._4_2_ < local_a8._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_a8._4_2_) * local_a8._4_2_;
  local_1218._6_2_ =
       (ushort)(local_b8._6_2_ < local_a8._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_a8._6_2_) * local_a8._6_2_;
  local_1218._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_a0) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_a0) * (short)uStack_a0;
  local_1218._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_a0._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_a0._2_2_) * uStack_a0._2_2_;
  local_1218._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_a0._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_a0._4_2_) * uStack_a0._4_2_;
  local_1218._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_a0._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_a0._6_2_) * uStack_a0._6_2_;
  uVar7 = local_1218._0_8_;
  uVar8 = local_1218._8_8_;
  uVar9 = local_11d8._0_8_;
  uVar10 = local_11d8._8_8_;
  local_1a8._0_2_ = local_1218._0_2_;
  local_1a8._2_2_ = local_1218._2_2_;
  local_1a8._4_2_ = local_1218._4_2_;
  local_1a8._6_2_ = local_1218._6_2_;
  uStack_1a0._0_2_ = local_1218._8_2_;
  uStack_1a0._2_2_ = local_1218._10_2_;
  uStack_1a0._4_2_ = local_1218._12_2_;
  uStack_1a0._6_2_ = local_1218._14_2_;
  local_1b8._0_2_ = local_11d8._0_2_;
  local_1b8._2_2_ = local_11d8._2_2_;
  local_1b8._4_2_ = local_11d8._4_2_;
  local_1b8._6_2_ = local_11d8._6_2_;
  uStack_1b0._0_2_ = local_11d8._8_2_;
  uStack_1b0._2_2_ = local_11d8._10_2_;
  uStack_1b0._4_2_ = local_11d8._12_2_;
  uStack_1b0._6_2_ = local_11d8._14_2_;
  local_1218._0_2_ =
       (ushort)((short)local_1a8 < (short)local_1b8) * (short)local_1b8 |
       (ushort)((short)local_1a8 >= (short)local_1b8) * (short)local_1a8;
  local_1218._2_2_ =
       (ushort)(local_1a8._2_2_ < local_1b8._2_2_) * local_1b8._2_2_ |
       (ushort)(local_1a8._2_2_ >= local_1b8._2_2_) * local_1a8._2_2_;
  local_1218._4_2_ =
       (ushort)(local_1a8._4_2_ < local_1b8._4_2_) * local_1b8._4_2_ |
       (ushort)(local_1a8._4_2_ >= local_1b8._4_2_) * local_1a8._4_2_;
  local_1218._6_2_ =
       (ushort)(local_1a8._6_2_ < local_1b8._6_2_) * local_1b8._6_2_ |
       (ushort)(local_1a8._6_2_ >= local_1b8._6_2_) * local_1a8._6_2_;
  local_1218._8_2_ =
       (ushort)((short)uStack_1a0 < (short)uStack_1b0) * (short)uStack_1b0 |
       (ushort)((short)uStack_1a0 >= (short)uStack_1b0) * (short)uStack_1a0;
  local_1218._10_2_ =
       (ushort)(uStack_1a0._2_2_ < uStack_1b0._2_2_) * uStack_1b0._2_2_ |
       (ushort)(uStack_1a0._2_2_ >= uStack_1b0._2_2_) * uStack_1a0._2_2_;
  local_1218._12_2_ =
       (ushort)(uStack_1a0._4_2_ < uStack_1b0._4_2_) * uStack_1b0._4_2_ |
       (ushort)(uStack_1a0._4_2_ >= uStack_1b0._4_2_) * uStack_1a0._4_2_;
  local_1218._14_2_ =
       (ushort)(uStack_1a0._6_2_ < uStack_1b0._6_2_) * uStack_1b0._6_2_ |
       (ushort)(uStack_1a0._6_2_ >= uStack_1b0._6_2_) * uStack_1a0._6_2_;
  local_10c8 = *puVar167;
  uStack_10c0 = puVar167[1];
  local_10b8 = local_1218._8_8_;
  uStack_10b0 = 0;
  local_428 = local_1218._8_8_ & local_10c8;
  uStack_420 = 0;
  local_438 = local_1218._0_8_;
  uStack_430 = local_1218._8_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_428;
  auVar155 = psubsw(auVar75,local_1218);
  local_1228._0_8_ = auVar155._0_8_;
  local_1228._8_8_ = auVar155._8_8_;
  local_448 = local_1228._0_8_;
  uStack_440 = local_1228._8_8_;
  local_458 = local_1218._0_8_;
  uStack_450 = local_1218._8_8_;
  auVar155 = psubsw(auVar155,local_1218);
  local_1228._0_8_ = auVar155._0_8_;
  local_1228._8_8_ = auVar155._8_8_;
  local_468 = local_1228._0_8_;
  uStack_460 = local_1228._8_8_;
  local_478 = local_1218._0_8_;
  uStack_470 = local_1218._8_8_;
  local_1228 = psubsw(auVar155,local_1218);
  local_210 = local_1228;
  uVar11 = local_1228._0_8_;
  uVar12 = local_1228._8_8_;
  local_98 = local_11c8._0_8_;
  uStack_90 = local_11c8._8_8_;
  local_88._0_2_ = local_1228._0_2_;
  local_88._2_2_ = local_1228._2_2_;
  local_88._4_2_ = local_1228._4_2_;
  local_88._6_2_ = local_1228._6_2_;
  uStack_80._0_2_ = local_1228._8_2_;
  uStack_80._2_2_ = local_1228._10_2_;
  uStack_80._4_2_ = local_1228._12_2_;
  uStack_80._6_2_ = local_1228._14_2_;
  local_1228._0_2_ =
       (ushort)((short)local_b8 < (short)local_88) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_88) * (short)local_88;
  local_1228._2_2_ =
       (ushort)(local_b8._2_2_ < local_88._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_88._2_2_) * local_88._2_2_;
  local_1228._4_2_ =
       (ushort)(local_b8._4_2_ < local_88._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_88._4_2_) * local_88._4_2_;
  local_1228._6_2_ =
       (ushort)(local_b8._6_2_ < local_88._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_88._6_2_) * local_88._6_2_;
  local_1228._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_80) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_80) * (short)uStack_80;
  local_1228._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_80._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_80._2_2_) * uStack_80._2_2_;
  local_1228._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_80._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_80._4_2_) * uStack_80._4_2_;
  local_1228._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_80._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_80._6_2_) * uStack_80._6_2_;
  uVar13 = local_1228._0_8_;
  uVar14 = local_1228._8_8_;
  local_11d8._0_8_ = auVar152._0_8_;
  uVar15 = local_11d8._0_8_;
  local_11d8._8_8_ = auVar152._8_8_;
  uVar16 = local_11d8._8_8_;
  local_1e8._0_2_ = local_1228._0_2_;
  local_1e8._2_2_ = local_1228._2_2_;
  local_1e8._4_2_ = local_1228._4_2_;
  local_1e8._6_2_ = local_1228._6_2_;
  uStack_1e0._0_2_ = local_1228._8_2_;
  uStack_1e0._2_2_ = local_1228._10_2_;
  uStack_1e0._4_2_ = local_1228._12_2_;
  uStack_1e0._6_2_ = local_1228._14_2_;
  local_1f8._0_2_ = auVar152._0_2_;
  local_1f8._2_2_ = auVar152._2_2_;
  local_1f8._4_2_ = auVar152._4_2_;
  local_1f8._6_2_ = auVar152._6_2_;
  uStack_1f0._0_2_ = auVar152._8_2_;
  uStack_1f0._2_2_ = auVar152._10_2_;
  uStack_1f0._4_2_ = auVar152._12_2_;
  uStack_1f0._6_2_ = auVar152._14_2_;
  local_1228._0_2_ =
       (ushort)((short)local_1e8 < (short)local_1f8) * (short)local_1f8 |
       (ushort)((short)local_1e8 >= (short)local_1f8) * (short)local_1e8;
  local_1228._2_2_ =
       (ushort)(local_1e8._2_2_ < local_1f8._2_2_) * local_1f8._2_2_ |
       (ushort)(local_1e8._2_2_ >= local_1f8._2_2_) * local_1e8._2_2_;
  local_1228._4_2_ =
       (ushort)(local_1e8._4_2_ < local_1f8._4_2_) * local_1f8._4_2_ |
       (ushort)(local_1e8._4_2_ >= local_1f8._4_2_) * local_1e8._4_2_;
  local_1228._6_2_ =
       (ushort)(local_1e8._6_2_ < local_1f8._6_2_) * local_1f8._6_2_ |
       (ushort)(local_1e8._6_2_ >= local_1f8._6_2_) * local_1e8._6_2_;
  local_1228._8_2_ =
       (ushort)((short)uStack_1e0 < (short)uStack_1f0) * (short)uStack_1f0 |
       (ushort)((short)uStack_1e0 >= (short)uStack_1f0) * (short)uStack_1e0;
  local_1228._10_2_ =
       (ushort)(uStack_1e0._2_2_ < uStack_1f0._2_2_) * uStack_1f0._2_2_ |
       (ushort)(uStack_1e0._2_2_ >= uStack_1f0._2_2_) * uStack_1e0._2_2_;
  local_1228._12_2_ =
       (ushort)(uStack_1e0._4_2_ < uStack_1f0._4_2_) * uStack_1f0._4_2_ |
       (ushort)(uStack_1e0._4_2_ >= uStack_1f0._4_2_) * uStack_1e0._4_2_;
  local_1228._14_2_ =
       (ushort)(uStack_1e0._6_2_ < uStack_1f0._6_2_) * uStack_1f0._6_2_ |
       (ushort)(uStack_1e0._6_2_ >= uStack_1f0._6_2_) * uStack_1e0._6_2_;
  local_1228._0_8_ = SUB168(local_1228,0);
  local_1228._8_8_ = SUB168(local_1228,8);
  local_10e8 = (*palVar168)[0];
  uStack_10e0 = (*palVar168)[1];
  local_10d8 = local_1228._0_8_;
  uStack_10d0 = local_1228._8_8_;
  local_1108 = local_1228._0_8_ & local_10e8;
  uStack_1100 = local_1228._8_8_ & uStack_10e0;
  local_118 = 0x4000400040004;
  uStack_110 = 0x3000300030003;
  auVar79._8_8_ = local_1108;
  auVar79._0_8_ = local_1108;
  auVar78._8_8_ = 0x3000300030003;
  auVar78._0_8_ = 0x4000400040004;
  local_1238 = paddsw(auVar79,auVar78);
  local_250 = local_1238;
  uVar17 = local_1238._0_8_;
  uVar18 = local_1238._8_8_;
  local_78 = local_11c8._0_8_;
  uStack_70 = local_11c8._8_8_;
  local_68._0_2_ = local_1238._0_2_;
  local_68._2_2_ = local_1238._2_2_;
  local_68._4_2_ = local_1238._4_2_;
  local_68._6_2_ = local_1238._6_2_;
  uStack_60._0_2_ = local_1238._8_2_;
  uStack_60._2_2_ = local_1238._10_2_;
  uStack_60._4_2_ = local_1238._12_2_;
  uStack_60._6_2_ = local_1238._14_2_;
  local_1238._0_2_ =
       (ushort)((short)local_b8 < (short)local_68) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_68) * (short)local_68;
  local_1238._2_2_ =
       (ushort)(local_b8._2_2_ < local_68._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_68._2_2_) * local_68._2_2_;
  local_1238._4_2_ =
       (ushort)(local_b8._4_2_ < local_68._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_68._4_2_) * local_68._4_2_;
  local_1238._6_2_ =
       (ushort)(local_b8._6_2_ < local_68._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_68._6_2_) * local_68._6_2_;
  local_1238._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_60) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_60) * (short)uStack_60;
  local_1238._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_60._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_60._2_2_) * uStack_60._2_2_;
  local_1238._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_60._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_60._4_2_) * uStack_60._4_2_;
  local_1238._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_60._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_60._6_2_) * uStack_60._6_2_;
  uVar19 = local_1238._0_8_;
  uVar20 = local_1238._8_8_;
  local_238 = local_11d8._0_8_;
  uStack_230 = local_11d8._8_8_;
  local_228._0_2_ = local_1238._0_2_;
  local_228._2_2_ = local_1238._2_2_;
  local_228._4_2_ = local_1238._4_2_;
  local_228._6_2_ = local_1238._6_2_;
  uStack_220._0_2_ = local_1238._8_2_;
  uStack_220._2_2_ = local_1238._10_2_;
  uStack_220._4_2_ = local_1238._12_2_;
  uStack_220._6_2_ = local_1238._14_2_;
  local_1238._0_2_ =
       (ushort)((short)local_228 < (short)local_1f8) * (short)local_1f8 |
       (ushort)((short)local_228 >= (short)local_1f8) * (short)local_228;
  local_1238._2_2_ =
       (ushort)(local_228._2_2_ < local_1f8._2_2_) * local_1f8._2_2_ |
       (ushort)(local_228._2_2_ >= local_1f8._2_2_) * local_228._2_2_;
  local_1238._4_2_ =
       (ushort)(local_228._4_2_ < local_1f8._4_2_) * local_1f8._4_2_ |
       (ushort)(local_228._4_2_ >= local_1f8._4_2_) * local_228._4_2_;
  local_1238._6_2_ =
       (ushort)(local_228._6_2_ < local_1f8._6_2_) * local_1f8._6_2_ |
       (ushort)(local_228._6_2_ >= local_1f8._6_2_) * local_228._6_2_;
  local_1238._8_2_ =
       (ushort)((short)uStack_220 < (short)uStack_1f0) * (short)uStack_1f0 |
       (ushort)((short)uStack_220 >= (short)uStack_1f0) * (short)uStack_220;
  local_1238._10_2_ =
       (ushort)(uStack_220._2_2_ < uStack_1f0._2_2_) * uStack_1f0._2_2_ |
       (ushort)(uStack_220._2_2_ >= uStack_1f0._2_2_) * uStack_220._2_2_;
  local_1238._12_2_ =
       (ushort)(uStack_220._4_2_ < uStack_1f0._4_2_) * uStack_1f0._4_2_ |
       (ushort)(uStack_220._4_2_ >= uStack_1f0._4_2_) * uStack_220._4_2_;
  local_1238._14_2_ =
       (ushort)(uStack_220._6_2_ < uStack_1f0._6_2_) * uStack_1f0._6_2_ |
       (ushort)(uStack_220._6_2_ >= uStack_1f0._6_2_) * uStack_220._6_2_;
  local_c8 = local_1238._0_8_;
  uStack_c0 = local_1238._8_8_;
  local_cc = 3;
  auVar156 = psraw(local_1238,ZEXT416(3));
  local_1238._0_8_ = auVar156._0_8_;
  local_1238._8_8_ = auVar156._8_8_;
  uStack_1130 = local_1238._8_8_;
  local_1118 = local_1238._0_8_;
  uStack_1110 = local_1238._8_8_;
  local_1128 = local_1238._0_8_;
  uStack_1120 = local_1238._8_8_;
  local_128 = local_1238._0_8_;
  uStack_120 = local_1238._0_8_;
  local_138 = 0x1000100010001;
  uStack_130 = 0x1000100010001;
  auVar77._8_8_ = local_1238._0_8_;
  auVar77._0_8_ = local_1238._0_8_;
  auVar76._8_8_ = 0x1000100010001;
  auVar76._0_8_ = 0x1000100010001;
  auVar155 = paddsw(auVar77,auVar76);
  local_1228._0_8_ = auVar155._0_8_;
  local_1228._8_8_ = auVar155._8_8_;
  local_e8 = local_1228._0_8_;
  uStack_e0 = local_1228._8_8_;
  local_ec = 1;
  auVar155 = psraw(auVar155,ZEXT416(1));
  local_548 = *puVar167;
  uStack_540 = puVar167[1];
  local_1228._0_8_ = auVar155._0_8_;
  local_1228._8_8_ = auVar155._8_8_;
  local_558 = local_1228._0_8_;
  uStack_550 = local_1228._8_8_;
  uStack_1250 = ~local_548 & local_1228._0_8_;
  uStack_1140 = ~uStack_540 & local_1228._8_8_;
  local_1228._8_8_ = uStack_1140;
  local_1228._0_8_ = uStack_1250;
  auVar155 = local_1228;
  local_1238._12_4_ = auVar156._12_4_;
  uVar86 = local_1238._12_4_;
  local_1228._0_4_ = (undefined4)uStack_1250;
  local_1228._12_4_ = (undefined4)(uStack_1140 >> 0x20);
  uStack_59c = local_1238._12_4_;
  local_598 = CONCAT44(local_598._4_4_,local_1228._0_4_);
  uStack_5ac = local_1228._12_4_;
  _local_5a8 = CONCAT44(auVar156._4_4_,local_1218._0_4_);
  uStack_1240 = uStack_5a0;
  uStack_123c = local_1238._12_4_;
  local_1238._4_4_ = local_1228._12_4_;
  local_1238._0_4_ = uStack_5b0;
  local_1238 = CONCAT88(uStack_1130,local_1238._0_8_);
  local_1138 = local_1238._0_8_;
  local_1258 = local_1238._0_8_;
  local_488 = local_1208._0_8_;
  uStack_480 = local_1208._8_8_;
  local_498 = local_1238._0_8_;
  auVar156._8_8_ = uStack_1250;
  auVar156._0_8_ = local_1238._0_8_;
  local_1208 = psubsw(auVar154,auVar156);
  uStack_150 = CONCAT44(uVar86,uStack_5a0);
  local_148 = local_11f8._0_8_;
  uStack_140 = local_11f8._8_8_;
  local_158 = local_1248;
  auVar154._8_8_ = uStack_150;
  auVar154._0_8_ = local_1248;
  local_11f8 = paddsw(auVar153,auVar154);
  local_290 = local_1208;
  uVar21 = local_1208._0_8_;
  uVar22 = local_1208._8_8_;
  local_58 = local_11c8._0_8_;
  uStack_50 = local_11c8._8_8_;
  local_48._0_2_ = local_1208._0_2_;
  local_48._2_2_ = local_1208._2_2_;
  local_48._4_2_ = local_1208._4_2_;
  local_48._6_2_ = local_1208._6_2_;
  uStack_40._0_2_ = local_1208._8_2_;
  uStack_40._2_2_ = local_1208._10_2_;
  uStack_40._4_2_ = local_1208._12_2_;
  uStack_40._6_2_ = local_1208._14_2_;
  local_1208._0_2_ =
       (ushort)((short)local_b8 < (short)local_48) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_48) * (short)local_48;
  local_1208._2_2_ =
       (ushort)(local_b8._2_2_ < local_48._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_48._2_2_) * local_48._2_2_;
  local_1208._4_2_ =
       (ushort)(local_b8._4_2_ < local_48._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_48._4_2_) * local_48._4_2_;
  local_1208._6_2_ =
       (ushort)(local_b8._6_2_ < local_48._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_48._6_2_) * local_48._6_2_;
  local_1208._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_40) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_40) * (short)uStack_40;
  local_1208._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_40._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_40._2_2_) * uStack_40._2_2_;
  local_1208._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_40._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_40._4_2_) * uStack_40._4_2_;
  local_1208._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_40._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_40._6_2_) * uStack_40._6_2_;
  uVar23 = local_1208._0_8_;
  uVar24 = local_1208._8_8_;
  local_278 = local_11d8._0_8_;
  uStack_270 = local_11d8._8_8_;
  local_268._0_2_ = local_1208._0_2_;
  local_268._2_2_ = local_1208._2_2_;
  local_268._4_2_ = local_1208._4_2_;
  local_268._6_2_ = local_1208._6_2_;
  uStack_260._0_2_ = local_1208._8_2_;
  uStack_260._2_2_ = local_1208._10_2_;
  uStack_260._4_2_ = local_1208._12_2_;
  uStack_260._6_2_ = local_1208._14_2_;
  local_1208._0_2_ =
       (ushort)((short)local_268 < (short)local_1f8) * (short)local_1f8 |
       (ushort)((short)local_268 >= (short)local_1f8) * (short)local_268;
  local_1208._2_2_ =
       (ushort)(local_268._2_2_ < local_1f8._2_2_) * local_1f8._2_2_ |
       (ushort)(local_268._2_2_ >= local_1f8._2_2_) * local_268._2_2_;
  local_1208._4_2_ =
       (ushort)(local_268._4_2_ < local_1f8._4_2_) * local_1f8._4_2_ |
       (ushort)(local_268._4_2_ >= local_1f8._4_2_) * local_268._4_2_;
  local_1208._6_2_ =
       (ushort)(local_268._6_2_ < local_1f8._6_2_) * local_1f8._6_2_ |
       (ushort)(local_268._6_2_ >= local_1f8._6_2_) * local_268._6_2_;
  local_1208._8_2_ =
       (ushort)((short)uStack_260 < (short)uStack_1f0) * (short)uStack_1f0 |
       (ushort)((short)uStack_260 >= (short)uStack_1f0) * (short)uStack_260;
  local_1208._10_2_ =
       (ushort)(uStack_260._2_2_ < uStack_1f0._2_2_) * uStack_1f0._2_2_ |
       (ushort)(uStack_260._2_2_ >= uStack_1f0._2_2_) * uStack_260._2_2_;
  local_1208._12_2_ =
       (ushort)(uStack_260._4_2_ < uStack_1f0._4_2_) * uStack_1f0._4_2_ |
       (ushort)(uStack_260._4_2_ >= uStack_1f0._4_2_) * uStack_260._4_2_;
  local_1208._14_2_ =
       (ushort)(uStack_260._6_2_ < uStack_1f0._6_2_) * uStack_1f0._6_2_ |
       (ushort)(uStack_260._6_2_ >= uStack_1f0._6_2_) * uStack_260._6_2_;
  local_2d0 = local_11f8;
  uVar25 = local_11f8._0_8_;
  uVar26 = local_11f8._8_8_;
  local_38 = local_11c8._0_8_;
  uStack_30 = local_11c8._8_8_;
  local_28._0_2_ = local_11f8._0_2_;
  local_28._2_2_ = local_11f8._2_2_;
  local_28._4_2_ = local_11f8._4_2_;
  local_28._6_2_ = local_11f8._6_2_;
  uStack_20._0_2_ = local_11f8._8_2_;
  uStack_20._2_2_ = local_11f8._10_2_;
  uStack_20._4_2_ = local_11f8._12_2_;
  uStack_20._6_2_ = local_11f8._14_2_;
  local_11f8._0_2_ =
       (ushort)((short)local_b8 < (short)local_28) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_28) * (short)local_28;
  local_11f8._2_2_ =
       (ushort)(local_b8._2_2_ < local_28._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_28._2_2_) * local_28._2_2_;
  local_11f8._4_2_ =
       (ushort)(local_b8._4_2_ < local_28._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_28._4_2_) * local_28._4_2_;
  local_11f8._6_2_ =
       (ushort)(local_b8._6_2_ < local_28._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_28._6_2_) * local_28._6_2_;
  local_11f8._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_20) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_20) * (short)uStack_20;
  local_11f8._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_20._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_20._2_2_) * uStack_20._2_2_;
  local_11f8._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_20._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_20._4_2_) * uStack_20._4_2_;
  local_11f8._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_20._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_20._6_2_) * uStack_20._6_2_;
  uVar27 = local_11f8._0_8_;
  uVar28 = local_11f8._8_8_;
  local_2b8 = local_11d8._0_8_;
  uStack_2b0 = local_11d8._8_8_;
  local_2a8._0_2_ = local_11f8._0_2_;
  local_2a8._2_2_ = local_11f8._2_2_;
  local_2a8._4_2_ = local_11f8._4_2_;
  local_2a8._6_2_ = local_11f8._6_2_;
  uStack_2a0._0_2_ = local_11f8._8_2_;
  uStack_2a0._2_2_ = local_11f8._10_2_;
  uStack_2a0._4_2_ = local_11f8._12_2_;
  uStack_2a0._6_2_ = local_11f8._14_2_;
  local_11f8._0_2_ =
       (ushort)((short)local_2a8 < (short)local_1f8) * (short)local_1f8 |
       (ushort)((short)local_2a8 >= (short)local_1f8) * (short)local_2a8;
  local_11f8._2_2_ =
       (ushort)(local_2a8._2_2_ < local_1f8._2_2_) * local_1f8._2_2_ |
       (ushort)(local_2a8._2_2_ >= local_1f8._2_2_) * local_2a8._2_2_;
  local_11f8._4_2_ =
       (ushort)(local_2a8._4_2_ < local_1f8._4_2_) * local_1f8._4_2_ |
       (ushort)(local_2a8._4_2_ >= local_1f8._4_2_) * local_2a8._4_2_;
  local_11f8._6_2_ =
       (ushort)(local_2a8._6_2_ < local_1f8._6_2_) * local_1f8._6_2_ |
       (ushort)(local_2a8._6_2_ >= local_1f8._6_2_) * local_2a8._6_2_;
  local_11f8._8_2_ =
       (ushort)((short)uStack_2a0 < (short)uStack_1f0) * (short)uStack_1f0 |
       (ushort)((short)uStack_2a0 >= (short)uStack_1f0) * (short)uStack_2a0;
  local_11f8._10_2_ =
       (ushort)(uStack_2a0._2_2_ < uStack_1f0._2_2_) * uStack_1f0._2_2_ |
       (ushort)(uStack_2a0._2_2_ >= uStack_1f0._2_2_) * uStack_2a0._2_2_;
  local_11f8._12_2_ =
       (ushort)(uStack_2a0._4_2_ < uStack_1f0._4_2_) * uStack_1f0._4_2_ |
       (ushort)(uStack_2a0._4_2_ >= uStack_1f0._4_2_) * uStack_2a0._4_2_;
  local_11f8._14_2_ =
       (ushort)(uStack_2a0._6_2_ < uStack_1f0._6_2_) * uStack_1f0._6_2_ |
       (ushort)(uStack_2a0._6_2_ >= uStack_1f0._6_2_) * uStack_2a0._6_2_;
  auVar84._8_8_ = lStack_15f0;
  auVar84._0_8_ = local_15f8;
  local_168 = local_1208._0_8_;
  uStack_160 = local_1208._8_8_;
  auVar156 = paddsw(local_1208,auVar84);
  uStack_165c = auVar156._12_4_;
  local_1668 = auVar156._0_8_;
  auVar85._8_8_ = lStack_15f0;
  auVar85._0_8_ = local_15f8;
  local_188 = local_11f8._0_8_;
  uStack_180 = local_11f8._8_8_;
  auVar156 = paddsw(local_11f8,auVar85);
  uStack_164c = auVar156._12_4_;
  uStack_1654 = auVar156._4_4_;
  local_1658 = auVar156._0_4_;
  local_1228 = auVar155;
  local_11d8 = auVar152;
  local_1178 = palVar168;
  local_1170 = puVar167;
  local_1168 = p1p0_00;
  local_1160 = palVar166;
  local_1148 = uStack_1250;
  local_10f8 = local_1108;
  uStack_10f0 = uStack_1100;
  local_5b8 = uStack_1250;
  local_4a8 = local_11b8;
  uStack_4a0 = uStack_11b0;
  uStack_490 = uStack_1250;
  local_378 = local_11b8;
  uStack_370 = uStack_11b0;
  local_318 = local_11b8;
  uStack_310 = uStack_11b0;
  local_2f8 = local_11e8;
  uStack_2f0 = uStack_11e0;
  local_2a8 = uVar27;
  uStack_2a0 = uVar28;
  local_288 = local_2c8;
  local_280 = local_2c0;
  local_268 = uVar23;
  uStack_260 = uVar24;
  local_248 = local_2c8;
  local_240 = local_2c0;
  local_228 = uVar19;
  uStack_220 = uVar20;
  local_208 = local_2c8;
  local_200 = local_2c0;
  local_1f8 = uVar15;
  uStack_1f0 = uVar16;
  local_1e8 = uVar13;
  uStack_1e0 = uVar14;
  local_1c8 = local_2c8;
  local_1c0 = local_2c0;
  local_1b8 = uVar9;
  uStack_1b0 = uVar10;
  local_1a8 = uVar7;
  uStack_1a0 = uVar8;
  local_108 = local_1108;
  uStack_100 = local_1108;
  local_b8 = local_11c8._0_8_;
  uStack_b0 = local_11c8._8_8_;
  local_a8 = uVar5;
  uStack_a0 = uVar6;
  local_88 = uVar11;
  uStack_80 = uVar12;
  local_68 = uVar17;
  uStack_60 = uVar18;
  local_48 = uVar21;
  uStack_40 = uVar22;
  local_28 = uVar25;
  uStack_20 = uVar26;
  highbd_flat_mask4_sse2(x2,x3,palVar165,(int)((ulong)puVar164 >> 0x20));
  plVar150 = local_1580;
  lVar1 = local_1668;
  local_1038 = local_1678;
  uStack_1030 = uStack_1670;
  local_1048 = local_1608;
  uStack_1040 = uStack_1600;
  local_1068 = local_1678 & local_1608;
  uStack_1060 = uStack_1670 & uStack_1600;
  local_1058 = local_1688;
  uStack_1050 = uStack_1680;
  local_1288 = local_1688 & local_1068;
  local_1268 = local_1068;
  uStack_1260 = uStack_1060;
  local_1278 = local_1068;
  uStack_1270 = uStack_1060;
  local_1678 = local_1068;
  uStack_1670 = local_1068;
  uStack_1280 = uStack_1680 & uStack_1060;
  local_1298 = local_1288;
  uStack_1290 = uStack_1680 & uStack_1060;
  local_1688 = local_1288;
  uStack_1680 = local_1288;
  local_fd8 = local_1068;
  uVar87 = local_fd8;
  uStack_fd0 = local_1068;
  local_fe8 = local_15b8;
  uVar5 = local_fe8;
  uStack_fe0 = uStack_15b0;
  uVar6 = uStack_fe0;
  local_fd8._0_2_ = (short)local_1068;
  local_fd8._2_2_ = (short)(local_1068 >> 0x10);
  local_fd8._4_2_ = (short)(local_1068 >> 0x20);
  local_fd8._6_2_ = (short)(local_1068 >> 0x30);
  local_fe8._0_2_ = (short)local_15b8;
  local_fe8._2_2_ = (short)((ulong)local_15b8 >> 0x10);
  local_fe8._4_2_ = (short)((ulong)local_15b8 >> 0x20);
  local_fe8._6_2_ = (short)((ulong)local_15b8 >> 0x30);
  uStack_fe0._0_2_ = (short)uStack_15b0;
  uStack_fe0._2_2_ = (short)((ulong)uStack_15b0 >> 0x10);
  uStack_fe0._4_2_ = (short)((ulong)uStack_15b0 >> 0x20);
  uStack_fe0._6_2_ = (short)((ulong)uStack_15b0 >> 0x30);
  uStack_100a = -(ushort)(local_fd8._6_2_ == uStack_fe0._6_2_);
  local_1018 = -(ushort)((short)local_fd8 == (short)local_fe8);
  sStack_1016 = -(ushort)(local_fd8._2_2_ == local_fe8._2_2_);
  sStack_1014 = -(ushort)(local_fd8._4_2_ == local_fe8._4_2_);
  sStack_1012 = -(ushort)(local_fd8._6_2_ == local_fe8._6_2_);
  sStack_1010 = -(ushort)((short)local_fd8 == (short)uStack_fe0);
  sStack_100e = -(ushort)(local_fd8._2_2_ == uStack_fe0._2_2_);
  sStack_100c = -(ushort)(local_fd8._4_2_ == uStack_fe0._4_2_);
  auVar155._2_2_ = -(ushort)(local_fd8._2_2_ == local_fe8._2_2_);
  auVar155._0_2_ = -(ushort)((short)local_fd8 == (short)local_fe8);
  auVar155._4_2_ = -(ushort)(local_fd8._4_2_ == local_fe8._4_2_);
  auVar155._6_2_ = -(ushort)(local_fd8._6_2_ == local_fe8._6_2_);
  auVar155._8_2_ = -(ushort)((short)local_fd8 == (short)uStack_fe0);
  auVar155._10_2_ = -(ushort)(local_fd8._2_2_ == uStack_fe0._2_2_);
  auVar155._12_2_ = -(ushort)(local_fd8._4_2_ == uStack_fe0._4_2_);
  auVar155._14_2_ = uStack_100a;
  local_fe8 = uVar5;
  uStack_fe0 = uVar6;
  local_fd8 = uVar87;
  if ((ushort)((ushort)(SUB161(auVar155 >> 7,0) & 1) | (ushort)(SUB161(auVar155 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar155 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar155 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar155 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar155 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar155 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar155 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar155 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar155 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar155 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar155 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar155 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar155 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uStack_100a >> 7) & 1) << 0xe | uStack_100a & 0x8000) == 0xffff) {
    local_12b8 = local_1668;
    *local_1580 = CONCAT44(uStack_1654,local_1658);
    plVar150[1] = lVar1;
    plVar150 = local_1580;
    uStack_55c = uStack_164c;
    local_558 = CONCAT44(local_558._4_4_,local_1648);
    local_578 = local_1668;
    uStack_56c = uStack_165c;
    *(undefined4 *)(local_1580 + 3) = uStack_560;
    *(undefined4 *)((long)plVar150 + 0x1c) = uStack_164c;
    *(undefined4 *)(plVar150 + 4) = uStack_570;
    *(undefined4 *)((long)plVar150 + 0x24) = uStack_165c;
  }
  else {
    local_fba = 8;
    local_33a = 8;
    local_33c = 8;
    local_33e = 8;
    local_340 = 8;
    local_342 = 8;
    local_344 = 8;
    local_346 = 8;
    local_348 = 8;
    local_968 = 0x8000800080008;
    uStack_960 = 0x8000800080008;
    local_1868 = 0x8000800080008;
    uStack_1860 = 0x8000800080008;
    local_fbc = 4;
    local_31a = 4;
    local_31c = 4;
    local_31e = 4;
    local_320 = 4;
    local_322 = 4;
    local_324 = 4;
    local_326 = 4;
    local_328 = 4;
    local_338 = 0x4000400040004;
    uStack_9a0 = 0x4000400040004;
    local_1878 = 0x4000400040004;
    uStack_1870 = 0x4000400040004;
    lVar2 = local_1580[6];
    lVar3 = local_1580[7];
    lVar4 = local_1580[8];
    lVar29 = local_1580[9];
    lVar30 = local_1580[10];
    lVar31 = local_1580[0xb];
    local_8a8._0_2_ = (short)lVar4;
    local_8a8._2_2_ = (short)((ulong)lVar4 >> 0x10);
    local_8a8._4_2_ = (short)((ulong)lVar4 >> 0x20);
    local_8a8._6_2_ = (short)((ulong)lVar4 >> 0x30);
    uStack_8a0._0_2_ = (short)lVar29;
    uStack_8a0._2_2_ = (short)((ulong)lVar29 >> 0x10);
    uStack_8a0._4_2_ = (short)((ulong)lVar29 >> 0x20);
    uStack_8a0._6_2_ = (short)((ulong)lVar29 >> 0x30);
    local_8b8._0_2_ = (short)lVar2;
    local_8b8._2_2_ = (short)((ulong)lVar2 >> 0x10);
    local_8b8._4_2_ = (short)((ulong)lVar2 >> 0x20);
    local_8b8._6_2_ = (short)((ulong)lVar2 >> 0x30);
    uStack_8b0._0_2_ = (short)lVar3;
    uStack_8b0._2_2_ = (short)((ulong)lVar3 >> 0x10);
    uStack_8b0._4_2_ = (short)((ulong)lVar3 >> 0x20);
    uStack_8b0._6_2_ = (short)((ulong)lVar3 >> 0x30);
    local_8d8 = (short)local_8a8 + (short)local_8b8;
    sStack_8d6 = local_8a8._2_2_ + local_8b8._2_2_;
    sStack_8d4 = local_8a8._4_2_ + local_8b8._4_2_;
    sStack_8d2 = local_8a8._6_2_ + local_8b8._6_2_;
    sStack_8d0 = (short)uStack_8a0 + (short)uStack_8b0;
    sStack_8ce = uStack_8a0._2_2_ + uStack_8b0._2_2_;
    sStack_8cc = uStack_8a0._4_2_ + uStack_8b0._4_2_;
    sStack_8ca = uStack_8a0._6_2_ + uStack_8b0._6_2_;
    local_8c8._0_2_ = (short)lVar30;
    local_8c8._2_2_ = (short)((ulong)lVar30 >> 0x10);
    local_8c8._4_2_ = (short)((ulong)lVar30 >> 0x20);
    local_8c8._6_2_ = (short)((ulong)lVar30 >> 0x30);
    uStack_8c0._0_2_ = (short)lVar31;
    uStack_8c0._2_2_ = (short)((ulong)lVar31 >> 0x10);
    uStack_8c0._4_2_ = (short)((ulong)lVar31 >> 0x20);
    uStack_8c0._6_2_ = (short)((ulong)lVar31 >> 0x30);
    lVar32 = *local_1580;
    lVar33 = local_1580[1];
    lVar34 = local_1580[2];
    lVar35 = local_1580[3];
    lVar36 = local_1580[4];
    lVar37 = local_1580[5];
    local_8e8._0_2_ = (short)lVar36;
    local_8e8._2_2_ = (short)((ulong)lVar36 >> 0x10);
    local_8e8._4_2_ = (short)((ulong)lVar36 >> 0x20);
    local_8e8._6_2_ = (short)((ulong)lVar36 >> 0x30);
    uStack_8e0._0_2_ = (short)lVar37;
    uStack_8e0._2_2_ = (short)((ulong)lVar37 >> 0x10);
    uStack_8e0._4_2_ = (short)((ulong)lVar37 >> 0x20);
    uStack_8e0._6_2_ = (short)((ulong)lVar37 >> 0x30);
    local_8f8._0_2_ = (short)lVar34;
    local_8f8._2_2_ = (short)((ulong)lVar34 >> 0x10);
    local_8f8._4_2_ = (short)((ulong)lVar34 >> 0x20);
    local_8f8._6_2_ = (short)((ulong)lVar34 >> 0x30);
    uStack_8f0._0_2_ = (short)lVar35;
    uStack_8f0._2_2_ = (short)((ulong)lVar35 >> 0x10);
    uStack_8f0._4_2_ = (short)((ulong)lVar35 >> 0x20);
    uStack_8f0._6_2_ = (short)((ulong)lVar35 >> 0x30);
    local_918 = (short)local_8e8 + (short)local_8f8;
    sStack_916 = local_8e8._2_2_ + local_8f8._2_2_;
    sStack_914 = local_8e8._4_2_ + local_8f8._4_2_;
    sStack_912 = local_8e8._6_2_ + local_8f8._6_2_;
    sStack_910 = (short)uStack_8e0 + (short)uStack_8f0;
    sStack_90e = uStack_8e0._2_2_ + uStack_8f0._2_2_;
    sStack_90c = uStack_8e0._4_2_ + uStack_8f0._4_2_;
    sStack_90a = uStack_8e0._6_2_ + uStack_8f0._6_2_;
    local_908._0_2_ = (short)lVar32;
    local_908._2_2_ = (short)((ulong)lVar32 >> 0x10);
    local_908._4_2_ = (short)((ulong)lVar32 >> 0x20);
    local_908._6_2_ = (short)((ulong)lVar32 >> 0x30);
    uStack_900._0_2_ = (short)lVar33;
    uStack_900._2_2_ = (short)((ulong)lVar33 >> 0x10);
    uStack_900._4_2_ = (short)((ulong)lVar33 >> 0x20);
    uStack_900._6_2_ = (short)((ulong)lVar33 >> 0x30);
    local_908._0_2_ = (short)local_908 + local_918;
    local_908._2_2_ = local_908._2_2_ + sStack_916;
    local_908._4_2_ = local_908._4_2_ + sStack_914;
    local_908._6_2_ = local_908._6_2_ + sStack_912;
    sStack_9b0 = (short)uStack_900 + sStack_910;
    sStack_9ae = uStack_900._2_2_ + sStack_90e;
    sStack_9ac = uStack_900._4_2_ + sStack_90c;
    sStack_9aa = uStack_900._6_2_ + sStack_90a;
    local_928 = CONCAT26(local_8c8._6_2_ + sStack_8d2,
                         CONCAT24(local_8c8._4_2_ + sStack_8d4,
                                  CONCAT22(local_8c8._2_2_ + sStack_8d6,(short)local_8c8 + local_8d8
                                          )));
    uStack_920 = CONCAT26(uStack_8c0._6_2_ + sStack_8ca,
                          CONCAT24(uStack_8c0._4_2_ + sStack_8cc,
                                   CONCAT22(uStack_8c0._2_2_ + sStack_8ce,
                                            (short)uStack_8c0 + sStack_8d0)));
    local_938 = CONCAT26(local_908._6_2_,
                         CONCAT24(local_908._4_2_,CONCAT22(local_908._2_2_,(short)local_908)));
    uStack_930 = CONCAT26(sStack_9aa,CONCAT24(sStack_9ac,CONCAT22(sStack_9ae,sStack_9b0)));
    local_978 = (short)local_8c8 + local_8d8 + (short)local_908;
    sStack_976 = local_8c8._2_2_ + sStack_8d6 + local_908._2_2_;
    sStack_974 = local_8c8._4_2_ + sStack_8d4 + local_908._4_2_;
    sStack_972 = local_8c8._6_2_ + sStack_8d2 + local_908._6_2_;
    sStack_970 = (short)uStack_8c0 + sStack_8d0 + sStack_9b0;
    sStack_96e = uStack_8c0._2_2_ + sStack_8ce + sStack_9ae;
    sStack_96c = uStack_8c0._4_2_ + sStack_8cc + sStack_9ac;
    sStack_96a = uStack_8c0._6_2_ + sStack_8ca + sStack_9aa;
    local_998 = CONCAT26(sStack_9aa,CONCAT24(sStack_9ac,CONCAT22(sStack_9ae,sStack_9b0)));
    local_958 = CONCAT26(sStack_96a,CONCAT24(sStack_96c,CONCAT22(sStack_96e,sStack_970)));
    local_948 = CONCAT26(sStack_972,CONCAT24(sStack_974,CONCAT22(sStack_976,local_978)));
    uStack_940 = CONCAT26(sStack_96a,CONCAT24(sStack_96c,CONCAT22(sStack_96e,sStack_970)));
    uStack_950 = 0;
    local_978 = local_978 + sStack_970;
    sStack_976 = sStack_976 + sStack_96e;
    sStack_974 = sStack_974 + sStack_96c;
    sStack_972 = sStack_972 + sStack_96a;
    local_18b8 = local_978 + 8;
    sStack_18b6 = sStack_976 + 8;
    sStack_18b4 = sStack_974 + 8;
    sStack_18b2 = sStack_972 + 8;
    sStack_18b0 = sStack_970 + 8;
    sStack_18ae = sStack_96e + 8;
    sStack_18ac = sStack_96c + 8;
    sStack_18aa = sStack_96a + 8;
    local_988 = CONCAT26(local_908._6_2_,
                         CONCAT24(local_908._4_2_,CONCAT22(local_908._2_2_,(short)local_908)));
    uStack_980 = CONCAT26(sStack_9aa,CONCAT24(sStack_9ac,CONCAT22(sStack_9ae,sStack_9b0)));
    uStack_990 = 0;
    local_9a8 = 0x4000400040004;
    local_9b8 = (short)local_908 + sStack_9b0;
    sStack_9b6 = local_908._2_2_ + sStack_9ae;
    sStack_9b4 = local_908._4_2_ + sStack_9ac;
    sStack_9b2 = local_908._6_2_ + sStack_9aa;
    local_18d8 = (short)local_908 + sStack_9b0 + 4;
    sStack_18d6 = local_908._2_2_ + sStack_9ae + 4;
    sStack_18d4 = local_908._4_2_ + sStack_9ac + 4;
    sStack_18d2 = local_908._6_2_ + sStack_9aa + 4;
    sStack_18d0 = sStack_9b0 + 4;
    sStack_18ce = sStack_9ae + 4;
    sStack_18cc = sStack_9ac + 4;
    sStack_18ca = sStack_9aa + 4;
    lVar38 = *local_1580;
    lVar39 = local_1580[1];
    lVar40 = local_1580[6];
    lVar41 = local_1580[7];
    local_9c8 = lVar40;
    lVar146 = local_9c8;
    uStack_9c0 = lVar41;
    lVar147 = uStack_9c0;
    local_9d8 = lVar38;
    lVar144 = local_9d8;
    uStack_9d0 = lVar39;
    lVar145 = uStack_9d0;
    local_9c8._0_2_ = (short)lVar40;
    local_9c8._2_2_ = (short)((ulong)lVar40 >> 0x10);
    local_9c8._4_2_ = (short)((ulong)lVar40 >> 0x20);
    local_9c8._6_2_ = (short)((ulong)lVar40 >> 0x30);
    uStack_9c0._0_2_ = (short)lVar41;
    uStack_9c0._2_2_ = (short)((ulong)lVar41 >> 0x10);
    uStack_9c0._4_2_ = (short)((ulong)lVar41 >> 0x20);
    uStack_9c0._6_2_ = (short)((ulong)lVar41 >> 0x30);
    local_9d8._0_2_ = (short)lVar38;
    local_9d8._2_2_ = (short)((ulong)lVar38 >> 0x10);
    local_9d8._4_2_ = (short)((ulong)lVar38 >> 0x20);
    local_9d8._6_2_ = (short)((ulong)lVar38 >> 0x30);
    uStack_9d0._0_2_ = (short)lVar39;
    uStack_9d0._2_2_ = (short)((ulong)lVar39 >> 0x10);
    uStack_9d0._4_2_ = (short)((ulong)lVar39 >> 0x20);
    uStack_9d0._6_2_ = (short)((ulong)lVar39 >> 0x30);
    local_9e8 = CONCAT26(sStack_18d2,CONCAT24(sStack_18d4,CONCAT22(sStack_18d6,local_18d8)));
    uStack_9e0 = CONCAT26(sStack_18ca,CONCAT24(sStack_18cc,CONCAT22(sStack_18ce,sStack_18d0)));
    local_9f8 = (short)local_9c8 + (short)local_9d8;
    sStack_9f6 = local_9c8._2_2_ + local_9d8._2_2_;
    sStack_9f4 = local_9c8._4_2_ + local_9d8._4_2_;
    sStack_9f2 = local_9c8._6_2_ + local_9d8._6_2_;
    sStack_9f0 = (short)uStack_9c0 + (short)uStack_9d0;
    sStack_9ee = uStack_9c0._2_2_ + uStack_9d0._2_2_;
    sStack_9ec = uStack_9c0._4_2_ + uStack_9d0._4_2_;
    sStack_9ea = uStack_9c0._6_2_ + uStack_9d0._6_2_;
    local_16b8 = local_18d8 + (short)local_9c8 + (short)local_9d8;
    sStack_16b6 = sStack_18d6 + local_9c8._2_2_ + local_9d8._2_2_;
    sStack_16b4 = sStack_18d4 + local_9c8._4_2_ + local_9d8._4_2_;
    sStack_16b2 = sStack_18d2 + local_9c8._6_2_ + local_9d8._6_2_;
    sStack_16b0 = sStack_18d0 + (short)uStack_9c0 + (short)uStack_9d0;
    sStack_16ae = sStack_18ce + uStack_9c0._2_2_ + uStack_9d0._2_2_;
    sStack_16ac = sStack_18cc + uStack_9c0._4_2_ + uStack_9d0._4_2_;
    sStack_16aa = sStack_18ca + uStack_9c0._6_2_ + uStack_9d0._6_2_;
    lVar38 = (*local_1578)[0];
    lVar39 = (*local_1578)[1];
    lVar40 = local_1578[3][0];
    lVar41 = local_1578[3][1];
    local_a08 = lVar40;
    lVar142 = local_a08;
    uStack_a00 = lVar41;
    lVar143 = uStack_a00;
    local_a18 = lVar38;
    lVar140 = local_a18;
    uStack_a10 = lVar39;
    lVar141 = uStack_a10;
    local_a08._0_2_ = (short)lVar40;
    local_a08._2_2_ = (short)((ulong)lVar40 >> 0x10);
    local_a08._4_2_ = (short)((ulong)lVar40 >> 0x20);
    local_a08._6_2_ = (short)((ulong)lVar40 >> 0x30);
    uStack_a00._0_2_ = (short)lVar41;
    uStack_a00._2_2_ = (short)((ulong)lVar41 >> 0x10);
    uStack_a00._4_2_ = (short)((ulong)lVar41 >> 0x20);
    uStack_a00._6_2_ = (short)((ulong)lVar41 >> 0x30);
    local_a18._0_2_ = (short)lVar38;
    local_a18._2_2_ = (short)((ulong)lVar38 >> 0x10);
    local_a18._4_2_ = (short)((ulong)lVar38 >> 0x20);
    local_a18._6_2_ = (short)((ulong)lVar38 >> 0x30);
    uStack_a10._0_2_ = (short)lVar39;
    uStack_a10._2_2_ = (short)((ulong)lVar39 >> 0x10);
    uStack_a10._4_2_ = (short)((ulong)lVar39 >> 0x20);
    uStack_a10._6_2_ = (short)((ulong)lVar39 >> 0x30);
    local_a28 = CONCAT26(sStack_18d2,CONCAT24(sStack_18d4,CONCAT22(sStack_18d6,local_18d8)));
    uStack_a20 = CONCAT26(sStack_18ca,CONCAT24(sStack_18cc,CONCAT22(sStack_18ce,sStack_18d0)));
    local_a38 = (short)local_a08 + (short)local_a18;
    sStack_a36 = local_a08._2_2_ + local_a18._2_2_;
    sStack_a34 = local_a08._4_2_ + local_a18._4_2_;
    sStack_a32 = local_a08._6_2_ + local_a18._6_2_;
    sStack_a30 = (short)uStack_a00 + (short)uStack_a10;
    sStack_a2e = uStack_a00._2_2_ + uStack_a10._2_2_;
    sStack_a2c = uStack_a00._4_2_ + uStack_a10._4_2_;
    sStack_a2a = uStack_a00._6_2_ + uStack_a10._6_2_;
    local_16e8 = local_18d8 + (short)local_a08 + (short)local_a18;
    uStack_16e6 = sStack_18d6 + local_a08._2_2_ + local_a18._2_2_;
    uStack_16e4 = sStack_18d4 + local_a08._4_2_ + local_a18._4_2_;
    uStack_16e2 = sStack_18d2 + local_a08._6_2_ + local_a18._6_2_;
    sStack_16e0 = sStack_18d0 + (short)uStack_a00 + (short)uStack_a10;
    sStack_16de = sStack_18ce + uStack_a00._2_2_ + uStack_a10._2_2_;
    sStack_16dc = sStack_18cc + uStack_a00._4_2_ + uStack_a10._4_2_;
    sStack_16da = sStack_18ca + uStack_a00._6_2_ + uStack_a10._6_2_;
    local_a58 = local_1580[0xc];
    lStack_a50 = local_1580[0xd];
    local_a48 = local_a58;
    lVar138 = local_a48;
    uStack_a40 = lStack_a50;
    lVar139 = uStack_a40;
    local_a48._0_2_ = (short)local_a58;
    local_a48._2_2_ = (short)((ulong)local_a58 >> 0x10);
    local_a48._4_2_ = (short)((ulong)local_a58 >> 0x20);
    local_a48._6_2_ = (short)((ulong)local_a58 >> 0x30);
    uStack_a40._0_2_ = (short)lStack_a50;
    uStack_a40._2_2_ = (short)((ulong)lStack_a50 >> 0x10);
    uStack_a40._4_2_ = (short)((ulong)lStack_a50 >> 0x20);
    uStack_a40._6_2_ = (short)((ulong)lStack_a50 >> 0x30);
    local_1848 = (short)local_a48 * 2;
    sStack_1846 = local_a48._2_2_ * 2;
    sStack_1844 = local_a48._4_2_ * 2;
    sStack_1842 = local_a48._6_2_ * 2;
    sStack_1840 = (short)uStack_a40 * 2;
    sStack_183e = uStack_a40._2_2_ * 2;
    sStack_183c = uStack_a40._4_2_ * 2;
    sStack_183a = uStack_a40._6_2_ * 2;
    local_a78 = local_1580[6];
    lStack_a70 = local_1580[7];
    local_a68 = local_a78;
    lVar136 = local_a68;
    uStack_a60 = lStack_a70;
    lVar137 = uStack_a60;
    local_a68._0_2_ = (short)local_a78;
    local_a68._2_2_ = (short)((ulong)local_a78 >> 0x10);
    local_a68._4_2_ = (short)((ulong)local_a78 >> 0x20);
    local_a68._6_2_ = (short)((ulong)local_a78 >> 0x30);
    uStack_a60._0_2_ = (short)lStack_a70;
    uStack_a60._2_2_ = (short)((ulong)lStack_a70 >> 0x10);
    uStack_a60._4_2_ = (short)((ulong)lStack_a70 >> 0x20);
    uStack_a60._6_2_ = (short)((ulong)lStack_a70 >> 0x30);
    local_1858 = (short)local_a68 * 2;
    sStack_1856 = local_a68._2_2_ * 2;
    sStack_1854 = local_a68._4_2_ * 2;
    sStack_1852 = local_a68._6_2_ * 2;
    sStack_1850 = (short)uStack_a60 * 2;
    sStack_184e = uStack_a60._2_2_ * 2;
    sStack_184c = uStack_a60._4_2_ * 2;
    sStack_184a = uStack_a60._6_2_ * 2;
    local_6e8 = CONCAT26(sStack_18b2,CONCAT24(sStack_18b4,CONCAT22(sStack_18b6,local_18b8)));
    uStack_6e0 = CONCAT26(sStack_18aa,CONCAT24(sStack_18ac,CONCAT22(sStack_18ae,sStack_18b0)));
    lVar38 = local_1580[10];
    lVar39 = local_1580[0xb];
    local_6f8._0_2_ = (short)lVar38;
    local_6f8._2_2_ = (short)((ulong)lVar38 >> 0x10);
    local_6f8._4_2_ = (short)((ulong)lVar38 >> 0x20);
    local_6f8._6_2_ = (short)((ulong)lVar38 >> 0x30);
    uStack_6f0._0_2_ = (short)lVar39;
    uStack_6f0._2_2_ = (short)((ulong)lVar39 >> 0x10);
    uStack_6f0._4_2_ = (short)((ulong)lVar39 >> 0x20);
    uStack_6f0._6_2_ = (short)((ulong)lVar39 >> 0x30);
    local_6f8._0_2_ = local_18b8 - (short)local_6f8;
    local_6f8._2_2_ = sStack_18b6 - local_6f8._2_2_;
    local_6f8._4_2_ = sStack_18b4 - local_6f8._4_2_;
    local_6f8._6_2_ = sStack_18b2 - local_6f8._6_2_;
    uStack_6f0._0_2_ = sStack_18b0 - (short)uStack_6f0;
    uStack_6f0._2_2_ = sStack_18ae - uStack_6f0._2_2_;
    uStack_6f0._4_2_ = sStack_18ac - uStack_6f0._4_2_;
    uStack_6f0._6_2_ = sStack_18aa - uStack_6f0._6_2_;
    local_18f8._0_4_ = CONCAT22(local_6f8._2_2_,(short)local_6f8);
    local_18f8._0_6_ = CONCAT24(local_6f8._4_2_,(undefined4)local_18f8);
    local_18f8 = CONCAT26(local_6f8._6_2_,(undefined6)local_18f8);
    uStack_18f0._0_4_ = CONCAT22(uStack_6f0._2_2_,(short)uStack_6f0);
    uStack_18f0._0_6_ = CONCAT24(uStack_6f0._4_2_,(undefined4)uStack_18f0);
    uStack_18f0 = CONCAT26(uStack_6f0._6_2_,(undefined6)uStack_18f0);
    local_708 = CONCAT26(sStack_18b2,CONCAT24(sStack_18b4,CONCAT22(sStack_18b6,local_18b8)));
    uStack_700 = CONCAT26(sStack_18aa,CONCAT24(sStack_18ac,CONCAT22(sStack_18ae,sStack_18b0)));
    lVar40 = local_1578[5][0];
    lVar41 = local_1578[5][1];
    local_718._0_2_ = (short)lVar40;
    local_718._2_2_ = (short)((ulong)lVar40 >> 0x10);
    local_718._4_2_ = (short)((ulong)lVar40 >> 0x20);
    local_718._6_2_ = (short)((ulong)lVar40 >> 0x30);
    uStack_710._0_2_ = (short)lVar41;
    uStack_710._2_2_ = (short)((ulong)lVar41 >> 0x10);
    uStack_710._4_2_ = (short)((ulong)lVar41 >> 0x20);
    uStack_710._6_2_ = (short)((ulong)lVar41 >> 0x30);
    local_18c8 = local_18b8 - (short)local_718;
    sStack_18c6 = sStack_18b6 - local_718._2_2_;
    sStack_18c4 = sStack_18b4 - local_718._4_2_;
    sStack_18c2 = sStack_18b2 - local_718._6_2_;
    sStack_18c0 = sStack_18b0 - (short)uStack_710;
    sStack_18be = sStack_18ae - uStack_710._2_2_;
    sStack_18bc = sStack_18ac - uStack_710._4_2_;
    sStack_18ba = sStack_18aa - uStack_710._6_2_;
    lVar42 = *local_1580;
    lVar43 = local_1580[1];
    lVar44 = local_1580[0xc];
    lVar45 = local_1580[0xd];
    local_a88 = lVar44;
    lVar134 = local_a88;
    uStack_a80 = lVar45;
    lVar135 = uStack_a80;
    local_a98 = lVar42;
    lVar132 = local_a98;
    uStack_a90 = lVar43;
    lVar133 = uStack_a90;
    local_a88._0_2_ = (short)lVar44;
    local_a88._2_2_ = (short)((ulong)lVar44 >> 0x10);
    local_a88._4_2_ = (short)((ulong)lVar44 >> 0x20);
    local_a88._6_2_ = (short)((ulong)lVar44 >> 0x30);
    uStack_a80._0_2_ = (short)lVar45;
    uStack_a80._2_2_ = (short)((ulong)lVar45 >> 0x10);
    uStack_a80._4_2_ = (short)((ulong)lVar45 >> 0x20);
    uStack_a80._6_2_ = (short)((ulong)lVar45 >> 0x30);
    local_a98._0_2_ = (short)lVar42;
    local_a98._2_2_ = (short)((ulong)lVar42 >> 0x10);
    local_a98._4_2_ = (short)((ulong)lVar42 >> 0x20);
    local_a98._6_2_ = (short)((ulong)lVar42 >> 0x30);
    uStack_a90._0_2_ = (short)lVar43;
    uStack_a90._2_2_ = (short)((ulong)lVar43 >> 0x10);
    uStack_a90._4_2_ = (short)((ulong)lVar43 >> 0x20);
    uStack_a90._6_2_ = (short)((ulong)lVar43 >> 0x30);
    lVar42 = local_1580[2];
    lVar43 = local_1580[3];
    local_aa8 = (short)local_a88 + (short)local_a98;
    sStack_aa6 = local_a88._2_2_ + local_a98._2_2_;
    sStack_aa4 = local_a88._4_2_ + local_a98._4_2_;
    sStack_aa2 = local_a88._6_2_ + local_a98._6_2_;
    sStack_aa0 = (short)uStack_a80 + (short)uStack_a90;
    sStack_a9e = uStack_a80._2_2_ + uStack_a90._2_2_;
    sStack_a9c = uStack_a80._4_2_ + uStack_a90._4_2_;
    sStack_a9a = uStack_a80._6_2_ + uStack_a90._6_2_;
    local_ab8 = lVar42;
    lVar130 = local_ab8;
    uStack_ab0 = lVar43;
    lVar131 = uStack_ab0;
    local_ab8._0_2_ = (short)lVar42;
    local_ab8._2_2_ = (short)((ulong)lVar42 >> 0x10);
    local_ab8._4_2_ = (short)((ulong)lVar42 >> 0x20);
    local_ab8._6_2_ = (short)((ulong)lVar42 >> 0x30);
    uStack_ab0._0_2_ = (short)lVar43;
    uStack_ab0._2_2_ = (short)((ulong)lVar43 >> 0x10);
    uStack_ab0._4_2_ = (short)((ulong)lVar43 >> 0x20);
    uStack_ab0._6_2_ = (short)((ulong)lVar43 >> 0x30);
    local_1898 = (short)local_a88 + (short)local_a98 + (short)local_ab8;
    sStack_1896 = local_a88._2_2_ + local_a98._2_2_ + local_ab8._2_2_;
    sStack_1894 = local_a88._4_2_ + local_a98._4_2_ + local_ab8._4_2_;
    sStack_1892 = local_a88._6_2_ + local_a98._6_2_ + local_ab8._6_2_;
    sStack_1890 = (short)uStack_a80 + (short)uStack_a90 + (short)uStack_ab0;
    sStack_188e = uStack_a80._2_2_ + uStack_a90._2_2_ + uStack_ab0._2_2_;
    sStack_188c = uStack_a80._4_2_ + uStack_a90._4_2_ + uStack_ab0._4_2_;
    sStack_188a = uStack_a80._6_2_ + uStack_a90._6_2_ + uStack_ab0._6_2_;
    lVar42 = *local_1580;
    lVar43 = local_1580[1];
    lVar44 = local_1580[2];
    lVar45 = local_1580[3];
    lVar46 = local_1580[4];
    lVar47 = local_1580[5];
    local_ac8 = lVar46;
    lVar128 = local_ac8;
    uStack_ac0 = lVar47;
    lVar129 = uStack_ac0;
    local_ad8 = lVar42;
    lVar126 = local_ad8;
    uStack_ad0 = lVar43;
    lVar127 = uStack_ad0;
    local_ac8._0_2_ = (short)lVar46;
    local_ac8._2_2_ = (short)((ulong)lVar46 >> 0x10);
    local_ac8._4_2_ = (short)((ulong)lVar46 >> 0x20);
    local_ac8._6_2_ = (short)((ulong)lVar46 >> 0x30);
    uStack_ac0._0_2_ = (short)lVar47;
    uStack_ac0._2_2_ = (short)((ulong)lVar47 >> 0x10);
    uStack_ac0._4_2_ = (short)((ulong)lVar47 >> 0x20);
    uStack_ac0._6_2_ = (short)((ulong)lVar47 >> 0x30);
    local_ad8._0_2_ = (short)lVar42;
    local_ad8._2_2_ = (short)((ulong)lVar42 >> 0x10);
    local_ad8._4_2_ = (short)((ulong)lVar42 >> 0x20);
    local_ad8._6_2_ = (short)((ulong)lVar42 >> 0x30);
    uStack_ad0._0_2_ = (short)lVar43;
    uStack_ad0._2_2_ = (short)((ulong)lVar43 >> 0x10);
    uStack_ad0._4_2_ = (short)((ulong)lVar43 >> 0x20);
    uStack_ad0._6_2_ = (short)((ulong)lVar43 >> 0x30);
    local_ae8 = lVar44;
    lVar124 = local_ae8;
    uStack_ae0 = lVar45;
    lVar125 = uStack_ae0;
    local_af8 = (short)local_ac8 + (short)local_ad8;
    sStack_af6 = local_ac8._2_2_ + local_ad8._2_2_;
    sStack_af4 = local_ac8._4_2_ + local_ad8._4_2_;
    sStack_af2 = local_ac8._6_2_ + local_ad8._6_2_;
    sStack_af0 = (short)uStack_ac0 + (short)uStack_ad0;
    sStack_aee = uStack_ac0._2_2_ + uStack_ad0._2_2_;
    sStack_aec = uStack_ac0._4_2_ + uStack_ad0._4_2_;
    sStack_aea = uStack_ac0._6_2_ + uStack_ad0._6_2_;
    local_ae8._0_2_ = (short)lVar44;
    local_ae8._2_2_ = (short)((ulong)lVar44 >> 0x10);
    local_ae8._4_2_ = (short)((ulong)lVar44 >> 0x20);
    local_ae8._6_2_ = (short)((ulong)lVar44 >> 0x30);
    uStack_ae0._0_2_ = (short)lVar45;
    uStack_ae0._2_2_ = (short)((ulong)lVar45 >> 0x10);
    uStack_ae0._4_2_ = (short)((ulong)lVar45 >> 0x20);
    uStack_ae0._6_2_ = (short)((ulong)lVar45 >> 0x30);
    local_b18 = (short)local_ae8 + (short)local_ac8 + (short)local_ad8;
    sStack_b16 = local_ae8._2_2_ + local_ac8._2_2_ + local_ad8._2_2_;
    sStack_b14 = local_ae8._4_2_ + local_ac8._4_2_ + local_ad8._4_2_;
    sStack_b12 = local_ae8._6_2_ + local_ac8._6_2_ + local_ad8._6_2_;
    sStack_b10 = (short)uStack_ae0 + (short)uStack_ac0 + (short)uStack_ad0;
    sStack_b0e = uStack_ae0._2_2_ + uStack_ac0._2_2_ + uStack_ad0._2_2_;
    sStack_b0c = uStack_ae0._4_2_ + uStack_ac0._4_2_ + uStack_ad0._4_2_;
    sStack_b0a = uStack_ae0._6_2_ + uStack_ac0._6_2_ + uStack_ad0._6_2_;
    local_b08 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
    uStack_b00 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
    local_18a8 = local_1848 + local_b18;
    sStack_18a6 = sStack_1846 + sStack_b16;
    sStack_18a4 = sStack_1844 + sStack_b14;
    sStack_18a2 = sStack_1842 + sStack_b12;
    sStack_18a0 = sStack_1840 + sStack_b10;
    sStack_189e = sStack_183e + sStack_b0e;
    sStack_189c = sStack_183c + sStack_b0c;
    sStack_189a = sStack_183a + sStack_b0a;
    local_728 = CONCAT26(sStack_18d2,CONCAT24(sStack_18d4,CONCAT22(sStack_18d6,local_18d8)));
    uStack_720 = CONCAT26(sStack_18ca,CONCAT24(sStack_18cc,CONCAT22(sStack_18ce,sStack_18d0)));
    lVar42 = local_1580[4];
    lVar43 = local_1580[5];
    local_738._0_2_ = (short)lVar42;
    local_738._2_2_ = (short)((ulong)lVar42 >> 0x10);
    local_738._4_2_ = (short)((ulong)lVar42 >> 0x20);
    local_738._6_2_ = (short)((ulong)lVar42 >> 0x30);
    uStack_730._0_2_ = (short)lVar43;
    uStack_730._2_2_ = (short)((ulong)lVar43 >> 0x10);
    uStack_730._4_2_ = (short)((ulong)lVar43 >> 0x20);
    uStack_730._6_2_ = (short)((ulong)lVar43 >> 0x30);
    local_738._0_2_ = local_18d8 - (short)local_738;
    local_738._2_2_ = sStack_18d6 - local_738._2_2_;
    local_738._4_2_ = sStack_18d4 - local_738._4_2_;
    local_738._6_2_ = sStack_18d2 - local_738._6_2_;
    sStack_16d0 = sStack_18d0 - (short)uStack_730;
    sStack_16ce = sStack_18ce - uStack_730._2_2_;
    sStack_16cc = sStack_18cc - uStack_730._4_2_;
    sStack_16ca = sStack_18ca - uStack_730._6_2_;
    local_18e8._0_4_ = CONCAT22(local_738._2_2_,(short)local_738);
    local_18e8._0_6_ = CONCAT24(local_738._4_2_,(undefined4)local_18e8);
    local_18e8 = CONCAT26(local_738._6_2_,(undefined6)local_18e8);
    uStack_18e0._0_4_ = CONCAT22(sStack_16ce,sStack_16d0);
    uStack_18e0._0_6_ = CONCAT24(sStack_16cc,(undefined4)uStack_18e0);
    uStack_18e0 = CONCAT26(sStack_16ca,(undefined6)uStack_18e0);
    local_748 = CONCAT26(sStack_18d2,CONCAT24(sStack_18d4,CONCAT22(sStack_18d6,local_18d8)));
    uStack_740 = CONCAT26(sStack_18ca,CONCAT24(sStack_18cc,CONCAT22(sStack_18ce,sStack_18d0)));
    lVar44 = local_1578[2][0];
    lVar45 = local_1578[2][1];
    local_758._0_2_ = (short)lVar44;
    local_758._2_2_ = (short)((ulong)lVar44 >> 0x10);
    local_758._4_2_ = (short)((ulong)lVar44 >> 0x20);
    local_758._6_2_ = (short)((ulong)lVar44 >> 0x30);
    uStack_750._0_2_ = (short)lVar45;
    uStack_750._2_2_ = (short)((ulong)lVar45 >> 0x10);
    uStack_750._4_2_ = (short)((ulong)lVar45 >> 0x20);
    uStack_750._6_2_ = (short)((ulong)lVar45 >> 0x30);
    local_18d8 = local_18d8 - (short)local_758;
    sStack_18d6 = sStack_18d6 - local_758._2_2_;
    sStack_18d4 = sStack_18d4 - local_758._4_2_;
    sStack_18d2 = sStack_18d2 - local_758._6_2_;
    sStack_18d0 = sStack_18d0 - (short)uStack_750;
    sStack_18ce = sStack_18ce - uStack_750._2_2_;
    sStack_18cc = sStack_18cc - uStack_750._4_2_;
    sStack_18ca = sStack_18ca - uStack_750._6_2_;
    lVar46 = local_1580[2];
    lVar47 = local_1580[3];
    local_b28 = CONCAT26(sStack_1852,CONCAT24(sStack_1854,CONCAT22(sStack_1856,local_1858)));
    uStack_b20 = CONCAT26(sStack_184a,CONCAT24(sStack_184c,CONCAT22(sStack_184e,sStack_1850)));
    local_b38 = lVar46;
    lVar122 = local_b38;
    uStack_b30 = lVar47;
    lVar123 = uStack_b30;
    local_b38._0_2_ = (short)lVar46;
    local_b38._2_2_ = (short)((ulong)lVar46 >> 0x10);
    local_b38._4_2_ = (short)((ulong)lVar46 >> 0x20);
    local_b38._6_2_ = (short)((ulong)lVar46 >> 0x30);
    uStack_b30._0_2_ = (short)lVar47;
    uStack_b30._2_2_ = (short)((ulong)lVar47 >> 0x10);
    uStack_b30._4_2_ = (short)((ulong)lVar47 >> 0x20);
    uStack_b30._6_2_ = (short)((ulong)lVar47 >> 0x30);
    uStack_b30._0_2_ = sStack_1850 + (short)uStack_b30;
    uStack_b30._2_2_ = sStack_184e + uStack_b30._2_2_;
    uStack_b30._4_2_ = sStack_184c + uStack_b30._4_2_;
    uStack_b30._6_2_ = sStack_184a + uStack_b30._6_2_;
    local_b48 = CONCAT26(sStack_18d2,CONCAT24(sStack_18d4,CONCAT22(sStack_18d6,local_18d8)));
    uStack_b40 = CONCAT26(sStack_18ca,CONCAT24(sStack_18cc,CONCAT22(sStack_18ce,sStack_18d0)));
    local_b58 = CONCAT26(sStack_1852 + local_b38._6_2_,
                         CONCAT24(sStack_1854 + local_b38._4_2_,
                                  CONCAT22(sStack_1856 + local_b38._2_2_,
                                           local_1858 + (short)local_b38)));
    uStack_b50 = CONCAT26(uStack_b30._6_2_,
                          CONCAT24(uStack_b30._4_2_,CONCAT22(uStack_b30._2_2_,(short)uStack_b30)));
    local_16a8 = local_18d8 + local_1858 + (short)local_b38;
    uStack_16a6 = sStack_18d6 + sStack_1856 + local_b38._2_2_;
    uStack_16a4 = sStack_18d4 + sStack_1854 + local_b38._4_2_;
    uStack_16a2 = sStack_18d2 + sStack_1852 + local_b38._6_2_;
    sStack_16a0 = sStack_18d0 + (short)uStack_b30;
    sStack_169e = sStack_18ce + uStack_b30._2_2_;
    sStack_169c = sStack_18cc + uStack_b30._4_2_;
    sStack_169a = sStack_18ca + uStack_b30._6_2_;
    local_b68 = local_18e8;
    uStack_b60 = uStack_18e0;
    local_b78 = CONCAT26(uStack_b30._6_2_,
                         CONCAT24(uStack_b30._4_2_,CONCAT22(uStack_b30._2_2_,(short)uStack_b30)));
    uStack_b70 = 0;
    local_16d8 = (short)local_738 + (short)uStack_b30;
    uStack_16d6 = local_738._2_2_ + uStack_b30._2_2_;
    uStack_16d4 = local_738._4_2_ + uStack_b30._4_2_;
    uStack_16d2 = local_738._6_2_ + uStack_b30._6_2_;
    local_5c8 = CONCAT26(sStack_16b2,CONCAT24(sStack_16b4,CONCAT22(sStack_16b6,local_16b8)));
    uStack_5c0 = CONCAT26(uStack_16e2,CONCAT24(uStack_16e4,CONCAT22(uStack_16e6,local_16e8)));
    local_12c8 = local_5c8;
    uStack_12c0 = CONCAT26(sStack_16aa,CONCAT24(sStack_16ac,CONCAT22(sStack_16ae,sStack_16b0)));
    local_12d8 = uStack_5c0;
    uStack_12d0 = CONCAT26(sStack_16da,CONCAT24(sStack_16dc,CONCAT22(sStack_16de,sStack_16e0)));
    local_5cc = 3;
    uStack_1710._0_2_ = local_16e8 >> 3;
    uStack_1710._2_2_ = uStack_16e6 >> 3;
    uStack_1710._4_2_ = uStack_16e4 >> 3;
    uStack_1710._6_2_ = uStack_16e2 >> 3;
    local_5e8 = CONCAT26(uStack_16a2,CONCAT24(uStack_16a4,CONCAT22(uStack_16a6,local_16a8)));
    uStack_5e0 = CONCAT26(uStack_16d2,CONCAT24(uStack_16d4,CONCAT22(uStack_16d6,local_16d8)));
    local_12e8 = local_5e8;
    uStack_12e0 = CONCAT26(sStack_18ca + uStack_b30._6_2_,
                           CONCAT24(sStack_18cc + uStack_b30._4_2_,
                                    CONCAT22(sStack_18ce + uStack_b30._2_2_,
                                             sStack_18d0 + (short)uStack_b30)));
    local_12f8 = uStack_5e0;
    uStack_12f0 = CONCAT26(sStack_16ca,CONCAT24(sStack_16cc,CONCAT22(sStack_16ce,sStack_16d0)));
    local_5ec = 3;
    local_1708 = local_16a8 >> 3;
    uStack_1706 = uStack_16a6 >> 3;
    uStack_1704 = uStack_16a4 >> 3;
    uStack_1702 = uStack_16a2 >> 3;
    uStack_1700 = local_16d8 >> 3;
    uStack_16fe = uStack_16d6 >> 3;
    uStack_16fc = uStack_16d4 >> 3;
    uStack_16fa = uStack_16d2 >> 3;
    local_768 = CONCAT26(sStack_18d2,CONCAT24(sStack_18d4,CONCAT22(sStack_18d6,local_18d8)));
    uStack_760 = CONCAT26(sStack_18ca,CONCAT24(sStack_18cc,CONCAT22(sStack_18ce,sStack_18d0)));
    lVar46 = local_1578[1][0];
    lVar47 = local_1578[1][1];
    local_778._0_2_ = (short)lVar46;
    local_778._2_2_ = (short)((ulong)lVar46 >> 0x10);
    local_778._4_2_ = (short)((ulong)lVar46 >> 0x20);
    local_778._6_2_ = (short)((ulong)lVar46 >> 0x30);
    uStack_770._0_2_ = (short)lVar47;
    uStack_770._2_2_ = (short)((ulong)lVar47 >> 0x10);
    uStack_770._4_2_ = (short)((ulong)lVar47 >> 0x20);
    uStack_770._6_2_ = (short)((ulong)lVar47 >> 0x30);
    local_18d8 = local_18d8 - (short)local_778;
    sStack_18d6 = sStack_18d6 - local_778._2_2_;
    sStack_18d4 = sStack_18d4 - local_778._4_2_;
    sStack_18d2 = sStack_18d2 - local_778._6_2_;
    sStack_18d0 = sStack_18d0 - (short)uStack_770;
    sStack_18ce = sStack_18ce - uStack_770._2_2_;
    sStack_18cc = sStack_18cc - uStack_770._4_2_;
    sStack_18ca = sStack_18ca - uStack_770._6_2_;
    lVar48 = local_1580[2];
    lVar49 = local_1580[3];
    local_788 = local_18e8;
    uStack_780 = uStack_18e0;
    local_798._0_2_ = (short)lVar48;
    local_798._2_2_ = (short)((ulong)lVar48 >> 0x10);
    local_798._4_2_ = (short)((ulong)lVar48 >> 0x20);
    local_798._6_2_ = (short)((ulong)lVar48 >> 0x30);
    uStack_790._0_2_ = (short)lVar49;
    uStack_790._2_2_ = (short)((ulong)lVar49 >> 0x10);
    uStack_790._4_2_ = (short)((ulong)lVar49 >> 0x20);
    uStack_790._6_2_ = (short)((ulong)lVar49 >> 0x30);
    sStack_16c0 = sStack_16d0 - (short)uStack_790;
    sStack_16be = sStack_16ce - uStack_790._2_2_;
    sStack_16bc = sStack_16cc - uStack_790._4_2_;
    sStack_16ba = sStack_16ca - uStack_790._6_2_;
    local_18e8._0_4_ =
         CONCAT22(local_738._2_2_ - local_798._2_2_,(short)local_738 - (short)local_798);
    local_18e8._0_6_ = CONCAT24(local_738._4_2_ - local_798._4_2_,(undefined4)local_18e8);
    local_18e8 = CONCAT26(local_738._6_2_ - local_798._6_2_,(undefined6)local_18e8);
    uStack_18e0._0_4_ = CONCAT22(sStack_16be,sStack_16c0);
    uStack_18e0._0_6_ = CONCAT24(sStack_16bc,(undefined4)uStack_18e0);
    uStack_18e0 = CONCAT26(sStack_16ba,(undefined6)uStack_18e0);
    lVar50 = local_1580[6];
    lVar51 = local_1580[7];
    local_b88 = CONCAT26(sStack_1852,CONCAT24(sStack_1854,CONCAT22(sStack_1856,local_1858)));
    uStack_b80 = CONCAT26(sStack_184a,CONCAT24(sStack_184c,CONCAT22(sStack_184e,sStack_1850)));
    local_b98 = lVar50;
    lVar120 = local_b98;
    uStack_b90 = lVar51;
    lVar121 = uStack_b90;
    local_b98._0_2_ = (short)lVar50;
    local_b98._2_2_ = (short)((ulong)lVar50 >> 0x10);
    local_b98._4_2_ = (short)((ulong)lVar50 >> 0x20);
    local_b98._6_2_ = (short)((ulong)lVar50 >> 0x30);
    uStack_b90._0_2_ = (short)lVar51;
    uStack_b90._2_2_ = (short)((ulong)lVar51 >> 0x10);
    uStack_b90._4_2_ = (short)((ulong)lVar51 >> 0x20);
    uStack_b90._6_2_ = (short)((ulong)lVar51 >> 0x30);
    local_1858 = local_1858 + (short)local_b98;
    sStack_1856 = sStack_1856 + local_b98._2_2_;
    sStack_1854 = sStack_1854 + local_b98._4_2_;
    sStack_1852 = sStack_1852 + local_b98._6_2_;
    sStack_1850 = sStack_1850 + (short)uStack_b90;
    sStack_184e = sStack_184e + uStack_b90._2_2_;
    sStack_184c = sStack_184c + uStack_b90._4_2_;
    sStack_184a = sStack_184a + uStack_b90._6_2_;
    lVar50 = local_1580[4];
    lVar51 = local_1580[5];
    local_ba8 = CONCAT26(sStack_1852,CONCAT24(sStack_1854,CONCAT22(sStack_1856,local_1858)));
    uStack_ba0 = CONCAT26(sStack_184a,CONCAT24(sStack_184c,CONCAT22(sStack_184e,sStack_1850)));
    local_bb8 = lVar50;
    lVar50 = local_bb8;
    uStack_bb0 = lVar51;
    lVar51 = uStack_bb0;
    local_bb8._0_2_ = (short)lVar50;
    local_bb8._2_2_ = (short)((ulong)lVar50 >> 0x10);
    local_bb8._4_2_ = (short)((ulong)lVar50 >> 0x20);
    local_bb8._6_2_ = (short)((ulong)lVar50 >> 0x30);
    uStack_bb0._0_2_ = (short)lVar51;
    uStack_bb0._2_2_ = (short)((ulong)lVar51 >> 0x10);
    uStack_bb0._4_2_ = (short)((ulong)lVar51 >> 0x20);
    uStack_bb0._6_2_ = (short)((ulong)lVar51 >> 0x30);
    local_1888 = local_1858 + (short)local_bb8;
    sStack_1886 = sStack_1856 + local_bb8._2_2_;
    sStack_1884 = sStack_1854 + local_bb8._4_2_;
    sStack_1882 = sStack_1852 + local_bb8._6_2_;
    sStack_1880 = sStack_1850 + (short)uStack_bb0;
    sStack_187e = sStack_184e + uStack_bb0._2_2_;
    sStack_187c = sStack_184c + uStack_bb0._4_2_;
    sStack_187a = sStack_184a + uStack_bb0._6_2_;
    local_bc8 = CONCAT26(sStack_18d2,CONCAT24(sStack_18d4,CONCAT22(sStack_18d6,local_18d8)));
    uStack_bc0 = CONCAT26(sStack_18ca,CONCAT24(sStack_18cc,CONCAT22(sStack_18ce,sStack_18d0)));
    local_bd8 = CONCAT26(sStack_1882,CONCAT24(sStack_1884,CONCAT22(sStack_1886,local_1888)));
    uStack_bd0 = CONCAT26(sStack_187a,CONCAT24(sStack_187c,CONCAT22(sStack_187e,sStack_1880)));
    local_1698 = local_18d8 + local_1888;
    uStack_1696 = sStack_18d6 + sStack_1886;
    uStack_1694 = sStack_18d4 + sStack_1884;
    uStack_1692 = sStack_18d2 + sStack_1882;
    sStack_1690 = sStack_18d0 + sStack_1880;
    sStack_168e = sStack_18ce + sStack_187e;
    sStack_168c = sStack_18cc + sStack_187c;
    sStack_168a = sStack_18ca + sStack_187a;
    local_be8 = local_18e8;
    uStack_be0 = uStack_18e0;
    local_bf8 = CONCAT26(sStack_187a,CONCAT24(sStack_187c,CONCAT22(sStack_187e,sStack_1880)));
    uStack_bf0 = 0;
    local_16c8 = ((short)local_738 - (short)local_798) + sStack_1880;
    uStack_16c6 = (local_738._2_2_ - local_798._2_2_) + sStack_187e;
    uStack_16c4 = (local_738._4_2_ - local_798._4_2_) + sStack_187c;
    uStack_16c2 = (local_738._6_2_ - local_798._6_2_) + sStack_187a;
    local_608 = CONCAT26(uStack_1692,CONCAT24(uStack_1694,CONCAT22(uStack_1696,local_1698)));
    uStack_600 = CONCAT26(uStack_16c2,CONCAT24(uStack_16c4,CONCAT22(uStack_16c6,local_16c8)));
    local_1308 = local_608;
    uStack_1300 = CONCAT26(sStack_18ca + sStack_187a,
                           CONCAT24(sStack_18cc + sStack_187c,
                                    CONCAT22(sStack_18ce + sStack_187e,sStack_18d0 + sStack_1880)));
    local_1318 = uStack_600;
    uStack_1310 = CONCAT26(sStack_16ba,CONCAT24(sStack_16bc,CONCAT22(sStack_16be,sStack_16c0)));
    local_60c = 3;
    local_16f8 = local_1698 >> 3;
    uStack_16f6 = uStack_1696 >> 3;
    uStack_16f4 = uStack_1694 >> 3;
    uStack_16f2 = uStack_1692 >> 3;
    uStack_16f0 = local_16c8 >> 3;
    uStack_16ee = uStack_16c6 >> 3;
    uStack_16ec = uStack_16c4 >> 3;
    uStack_16ea = uStack_16c2 >> 3;
    local_ff8 = local_1288;
    uVar87 = local_ff8;
    uStack_ff0 = local_1288;
    local_1008 = local_15b8;
    uStack_1000 = uStack_15b0;
    local_ff8._0_2_ = (short)local_1288;
    local_ff8._2_2_ = (short)(local_1288 >> 0x10);
    local_ff8._4_2_ = (short)(local_1288 >> 0x20);
    local_ff8._6_2_ = (short)(local_1288 >> 0x30);
    uStack_101a = -(ushort)(local_ff8._6_2_ == uStack_fe0._6_2_);
    local_1028 = -(ushort)((short)local_ff8 == (short)local_fe8);
    sStack_1026 = -(ushort)(local_ff8._2_2_ == local_fe8._2_2_);
    sStack_1024 = -(ushort)(local_ff8._4_2_ == local_fe8._4_2_);
    sStack_1022 = -(ushort)(local_ff8._6_2_ == local_fe8._6_2_);
    sStack_1020 = -(ushort)((short)local_ff8 == (short)uStack_fe0);
    sStack_101e = -(ushort)(local_ff8._2_2_ == uStack_fe0._2_2_);
    sStack_101c = -(ushort)(local_ff8._4_2_ == uStack_fe0._4_2_);
    auVar74._2_2_ = -(ushort)(local_ff8._2_2_ == local_fe8._2_2_);
    auVar74._0_2_ = -(ushort)((short)local_ff8 == (short)local_fe8);
    auVar74._4_2_ = -(ushort)(local_ff8._4_2_ == local_fe8._4_2_);
    auVar74._6_2_ = -(ushort)(local_ff8._6_2_ == local_fe8._6_2_);
    auVar74._8_2_ = -(ushort)((short)local_ff8 == (short)uStack_fe0);
    auVar74._10_2_ = -(ushort)(local_ff8._2_2_ == uStack_fe0._2_2_);
    auVar74._12_2_ = -(ushort)(local_ff8._4_2_ == uStack_fe0._4_2_);
    auVar74._14_2_ = uStack_101a;
    local_18fc = (uint)((ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(uStack_101a >> 7) & 1) << 0xe |
                                uStack_101a & 0x8000) != 0xffff);
    if (local_18fc != 0) {
      lVar52 = (*local_1578)[0];
      lVar53 = (*local_1578)[1];
      local_c08 = CONCAT26(sStack_1892,CONCAT24(sStack_1894,CONCAT22(sStack_1896,local_1898)));
      uStack_c00 = CONCAT26(sStack_188a,CONCAT24(sStack_188c,CONCAT22(sStack_188e,sStack_1890)));
      local_c18 = lVar52;
      lVar118 = local_c18;
      uStack_c10 = lVar53;
      lVar119 = uStack_c10;
      local_c18._0_2_ = (short)lVar52;
      local_c18._2_2_ = (short)((ulong)lVar52 >> 0x10);
      local_c18._4_2_ = (short)((ulong)lVar52 >> 0x20);
      local_c18._6_2_ = (short)((ulong)lVar52 >> 0x30);
      uStack_c10._0_2_ = (short)lVar53;
      uStack_c10._2_2_ = (short)((ulong)lVar53 >> 0x10);
      uStack_c10._4_2_ = (short)((ulong)lVar53 >> 0x20);
      uStack_c10._6_2_ = (short)((ulong)lVar53 >> 0x30);
      local_c28 = CONCAT26(sStack_18b2,CONCAT24(sStack_18b4,CONCAT22(sStack_18b6,local_18b8)));
      uStack_c20 = CONCAT26(sStack_18aa,CONCAT24(sStack_18ac,CONCAT22(sStack_18ae,sStack_18b0)));
      local_c38 = local_1898 + (short)local_c18;
      sStack_c36 = sStack_1896 + local_c18._2_2_;
      sStack_c34 = sStack_1894 + local_c18._4_2_;
      sStack_c32 = sStack_1892 + local_c18._6_2_;
      sStack_c30 = sStack_1890 + (short)uStack_c10;
      sStack_c2e = sStack_188e + uStack_c10._2_2_;
      sStack_c2c = sStack_188c + uStack_c10._4_2_;
      sStack_c2a = sStack_188a + uStack_c10._6_2_;
      local_1778 = local_18b8 + local_1898 + (short)local_c18;
      uStack_1776 = sStack_18b6 + sStack_1896 + local_c18._2_2_;
      uStack_1774 = sStack_18b4 + sStack_1894 + local_c18._4_2_;
      uStack_1772 = sStack_18b2 + sStack_1892 + local_c18._6_2_;
      sStack_1770 = sStack_18b0 + sStack_1890 + (short)uStack_c10;
      sStack_176e = sStack_18ae + sStack_188e + uStack_c10._2_2_;
      sStack_176c = sStack_18ac + sStack_188c + uStack_c10._4_2_;
      sStack_176a = sStack_18aa + sStack_188a + uStack_c10._6_2_;
      lVar52 = *local_1580;
      lVar53 = local_1580[1];
      local_c48 = CONCAT26(sStack_188a,CONCAT24(sStack_188c,CONCAT22(sStack_188e,sStack_1890)));
      uStack_c40 = 0;
      local_c58 = lVar52;
      lVar116 = local_c58;
      uStack_c50 = lVar53;
      lVar117 = uStack_c50;
      local_c58._0_2_ = (short)lVar52;
      local_c58._2_2_ = (short)((ulong)lVar52 >> 0x10);
      local_c58._4_2_ = (short)((ulong)lVar52 >> 0x20);
      local_c58._6_2_ = (short)((ulong)lVar52 >> 0x30);
      uStack_c50._0_2_ = (short)lVar53;
      uStack_c50._2_2_ = (short)((ulong)lVar53 >> 0x10);
      uStack_c50._4_2_ = (short)((ulong)lVar53 >> 0x20);
      uStack_c50._6_2_ = (short)((ulong)lVar53 >> 0x30);
      local_c68 = CONCAT26(sStack_18b2,CONCAT24(sStack_18b4,CONCAT22(sStack_18b6,local_18b8)));
      uStack_c60 = CONCAT26(sStack_18aa,CONCAT24(sStack_18ac,CONCAT22(sStack_18ae,sStack_18b0)));
      local_c78 = sStack_1890 + (short)local_c58;
      sStack_c76 = sStack_188e + local_c58._2_2_;
      sStack_c74 = sStack_188c + local_c58._4_2_;
      sStack_c72 = sStack_188a + local_c58._6_2_;
      sStack_c70 = (short)uStack_c50;
      sStack_c6e = uStack_c50._2_2_;
      sStack_c6c = uStack_c50._4_2_;
      sStack_c6a = uStack_c50._6_2_;
      local_17d8 = local_18b8 + sStack_1890 + (short)local_c58;
      uStack_17d6 = sStack_18b6 + sStack_188e + local_c58._2_2_;
      uStack_17d4 = sStack_18b4 + sStack_188c + local_c58._4_2_;
      uStack_17d2 = sStack_18b2 + sStack_188a + local_c58._6_2_;
      sStack_17d0 = sStack_18b0 + (short)uStack_c50;
      sStack_17ce = sStack_18ae + uStack_c50._2_2_;
      sStack_17cc = sStack_18ac + uStack_c50._4_2_;
      sStack_17ca = sStack_18aa + uStack_c50._6_2_;
      local_c88 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_c80 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      local_c98 = CONCAT26(sStack_18a2,CONCAT24(sStack_18a4,CONCAT22(sStack_18a6,local_18a8)));
      uStack_c90 = CONCAT26(sStack_189a,CONCAT24(sStack_189c,CONCAT22(sStack_189e,sStack_18a0)));
      local_1768 = local_18c8 + local_18a8;
      uStack_1766 = sStack_18c6 + sStack_18a6;
      uStack_1764 = sStack_18c4 + sStack_18a4;
      uStack_1762 = sStack_18c2 + sStack_18a2;
      sStack_1760 = sStack_18c0 + sStack_18a0;
      sStack_175e = sStack_18be + sStack_189e;
      sStack_175c = sStack_18bc + sStack_189c;
      sStack_175a = sStack_18ba + sStack_189a;
      local_ca8 = local_18f8;
      uStack_ca0 = uStack_18f0;
      local_cb8 = CONCAT26(sStack_189a,CONCAT24(sStack_189c,CONCAT22(sStack_189e,sStack_18a0)));
      uStack_cb0 = 0;
      local_17c8 = (short)local_6f8 + sStack_18a0;
      uStack_17c6 = local_6f8._2_2_ + sStack_189e;
      uStack_17c4 = local_6f8._4_2_ + sStack_189c;
      uStack_17c2 = local_6f8._6_2_ + sStack_189a;
      sStack_17c0 = (short)uStack_6f0;
      sStack_17be = uStack_6f0._2_2_;
      sStack_17bc = uStack_6f0._4_2_;
      sStack_17ba = uStack_6f0._6_2_;
      local_628 = CONCAT26(uStack_1772,CONCAT24(uStack_1774,CONCAT22(uStack_1776,local_1778)));
      uStack_620 = CONCAT26(uStack_17d2,CONCAT24(uStack_17d4,CONCAT22(uStack_17d6,local_17d8)));
      local_1348 = local_628;
      uStack_1340 = CONCAT26(sStack_176a,CONCAT24(sStack_176c,CONCAT22(sStack_176e,sStack_1770)));
      local_1358 = uStack_620;
      uStack_1350 = CONCAT26(sStack_18aa + uStack_c50._6_2_,
                             CONCAT24(sStack_18ac + uStack_c50._4_2_,
                                      CONCAT22(sStack_18ae + uStack_c50._2_2_,
                                               sStack_18b0 + (short)uStack_c50)));
      local_62c = 4;
      local_1838._0_2_ = local_1778 >> 4;
      local_1838._2_2_ = uStack_1776 >> 4;
      local_1838._4_2_ = uStack_1774 >> 4;
      local_1838._6_2_ = uStack_1772 >> 4;
      uStack_1830._0_2_ = local_17d8 >> 4;
      uStack_1830._2_2_ = uStack_17d6 >> 4;
      uStack_1830._4_2_ = uStack_17d4 >> 4;
      uStack_1830._6_2_ = uStack_17d2 >> 4;
      local_648 = CONCAT26(uStack_1762,CONCAT24(uStack_1764,CONCAT22(uStack_1766,local_1768)));
      uStack_640 = CONCAT26(uStack_17c2,CONCAT24(uStack_17c4,CONCAT22(uStack_17c6,local_17c8)));
      local_1368 = local_648;
      uStack_1360 = CONCAT26(sStack_18ba + sStack_189a,
                             CONCAT24(sStack_18bc + sStack_189c,
                                      CONCAT22(sStack_18be + sStack_189e,sStack_18c0 + sStack_18a0))
                            );
      local_1378 = uStack_640;
      uStack_1370 = CONCAT26(uStack_6f0._6_2_,
                             CONCAT24(uStack_6f0._4_2_,CONCAT22(uStack_6f0._2_2_,(short)uStack_6f0))
                            );
      local_64c = 4;
      local_1828 = local_1768 >> 4;
      uStack_1826 = uStack_1766 >> 4;
      uStack_1824 = uStack_1764 >> 4;
      uStack_1822 = uStack_1762 >> 4;
      uStack_1820 = local_17c8 >> 4;
      uStack_181e = uStack_17c6 >> 4;
      uStack_181c = uStack_17c4 >> 4;
      uStack_181a = uStack_17c2 >> 4;
      local_7a8 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_7a0 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      lVar52 = local_1578[4][0];
      lVar53 = local_1578[4][1];
      local_7b8._0_2_ = (short)lVar52;
      local_7b8._2_2_ = (short)((ulong)lVar52 >> 0x10);
      local_7b8._4_2_ = (short)((ulong)lVar52 >> 0x20);
      local_7b8._6_2_ = (short)((ulong)lVar52 >> 0x30);
      uStack_7b0._0_2_ = (short)lVar53;
      uStack_7b0._2_2_ = (short)((ulong)lVar53 >> 0x10);
      uStack_7b0._4_2_ = (short)((ulong)lVar53 >> 0x20);
      uStack_7b0._6_2_ = (short)((ulong)lVar53 >> 0x30);
      local_18c8 = local_18c8 - (short)local_7b8;
      sStack_18c6 = sStack_18c6 - local_7b8._2_2_;
      sStack_18c4 = sStack_18c4 - local_7b8._4_2_;
      sStack_18c2 = sStack_18c2 - local_7b8._6_2_;
      sStack_18c0 = sStack_18c0 - (short)uStack_7b0;
      sStack_18be = sStack_18be - uStack_7b0._2_2_;
      sStack_18bc = sStack_18bc - uStack_7b0._4_2_;
      sStack_18ba = sStack_18ba - uStack_7b0._6_2_;
      lVar54 = local_1580[8];
      lVar55 = local_1580[9];
      local_7c8 = local_18f8;
      uStack_7c0 = uStack_18f0;
      local_7d8._0_2_ = (short)lVar54;
      local_7d8._2_2_ = (short)((ulong)lVar54 >> 0x10);
      local_7d8._4_2_ = (short)((ulong)lVar54 >> 0x20);
      local_7d8._6_2_ = (short)((ulong)lVar54 >> 0x30);
      uStack_7d0._0_2_ = (short)lVar55;
      uStack_7d0._2_2_ = (short)((ulong)lVar55 >> 0x10);
      uStack_7d0._4_2_ = (short)((ulong)lVar55 >> 0x20);
      uStack_7d0._6_2_ = (short)((ulong)lVar55 >> 0x30);
      local_6f8._0_2_ = (short)local_6f8 - (short)local_7d8;
      local_6f8._2_2_ = local_6f8._2_2_ - local_7d8._2_2_;
      local_6f8._4_2_ = local_6f8._4_2_ - local_7d8._4_2_;
      local_6f8._6_2_ = local_6f8._6_2_ - local_7d8._6_2_;
      sStack_17b0 = (short)uStack_6f0 - (short)uStack_7d0;
      sStack_17ae = uStack_6f0._2_2_ - uStack_7d0._2_2_;
      sStack_17ac = uStack_6f0._4_2_ - uStack_7d0._4_2_;
      sStack_17aa = uStack_6f0._6_2_ - uStack_7d0._6_2_;
      local_18f8._0_4_ = CONCAT22(local_6f8._2_2_,(short)local_6f8);
      local_18f8._0_6_ = CONCAT24(local_6f8._4_2_,(undefined4)local_18f8);
      local_18f8 = CONCAT26(local_6f8._6_2_,(undefined6)local_18f8);
      uStack_18f0._0_4_ = CONCAT22(sStack_17ae,sStack_17b0);
      uStack_18f0._0_6_ = CONCAT24(sStack_17ac,(undefined4)uStack_18f0);
      uStack_18f0 = CONCAT26(sStack_17aa,(undefined6)uStack_18f0);
      lVar56 = local_1580[0xc];
      lVar57 = local_1580[0xd];
      local_cc8 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
      uStack_cc0 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
      local_cd8 = lVar56;
      lVar114 = local_cd8;
      uStack_cd0 = lVar57;
      lVar115 = uStack_cd0;
      local_cd8._0_2_ = (short)lVar56;
      local_cd8._2_2_ = (short)((ulong)lVar56 >> 0x10);
      local_cd8._4_2_ = (short)((ulong)lVar56 >> 0x20);
      local_cd8._6_2_ = (short)((ulong)lVar56 >> 0x30);
      uStack_cd0._0_2_ = (short)lVar57;
      uStack_cd0._2_2_ = (short)((ulong)lVar57 >> 0x10);
      uStack_cd0._4_2_ = (short)((ulong)lVar57 >> 0x20);
      uStack_cd0._6_2_ = (short)((ulong)lVar57 >> 0x30);
      local_1848 = local_1848 + (short)local_cd8;
      sStack_1846 = sStack_1846 + local_cd8._2_2_;
      sStack_1844 = sStack_1844 + local_cd8._4_2_;
      sStack_1842 = sStack_1842 + local_cd8._6_2_;
      sStack_1840 = sStack_1840 + (short)uStack_cd0;
      sStack_183e = sStack_183e + uStack_cd0._2_2_;
      sStack_183c = sStack_183c + uStack_cd0._4_2_;
      sStack_183a = sStack_183a + uStack_cd0._6_2_;
      lVar56 = local_1580[2];
      lVar57 = local_1580[3];
      lVar58 = local_1580[4];
      lVar59 = local_1580[5];
      lVar60 = local_1580[6];
      lVar61 = local_1580[7];
      local_ce8 = lVar60;
      lVar112 = local_ce8;
      uStack_ce0 = lVar61;
      lVar113 = uStack_ce0;
      local_cf8 = lVar56;
      lVar110 = local_cf8;
      uStack_cf0 = lVar57;
      lVar111 = uStack_cf0;
      local_ce8._0_2_ = (short)lVar60;
      local_ce8._2_2_ = (short)((ulong)lVar60 >> 0x10);
      local_ce8._4_2_ = (short)((ulong)lVar60 >> 0x20);
      local_ce8._6_2_ = (short)((ulong)lVar60 >> 0x30);
      uStack_ce0._0_2_ = (short)lVar61;
      uStack_ce0._2_2_ = (short)((ulong)lVar61 >> 0x10);
      uStack_ce0._4_2_ = (short)((ulong)lVar61 >> 0x20);
      uStack_ce0._6_2_ = (short)((ulong)lVar61 >> 0x30);
      local_cf8._0_2_ = (short)lVar56;
      local_cf8._2_2_ = (short)((ulong)lVar56 >> 0x10);
      local_cf8._4_2_ = (short)((ulong)lVar56 >> 0x20);
      local_cf8._6_2_ = (short)((ulong)lVar56 >> 0x30);
      uStack_cf0._0_2_ = (short)lVar57;
      uStack_cf0._2_2_ = (short)((ulong)lVar57 >> 0x10);
      uStack_cf0._4_2_ = (short)((ulong)lVar57 >> 0x20);
      uStack_cf0._6_2_ = (short)((ulong)lVar57 >> 0x30);
      local_d08 = lVar58;
      lVar108 = local_d08;
      uStack_d00 = lVar59;
      lVar109 = uStack_d00;
      local_d18 = (short)local_ce8 + (short)local_cf8;
      sStack_d16 = local_ce8._2_2_ + local_cf8._2_2_;
      sStack_d14 = local_ce8._4_2_ + local_cf8._4_2_;
      sStack_d12 = local_ce8._6_2_ + local_cf8._6_2_;
      sStack_d10 = (short)uStack_ce0 + (short)uStack_cf0;
      sStack_d0e = uStack_ce0._2_2_ + uStack_cf0._2_2_;
      sStack_d0c = uStack_ce0._4_2_ + uStack_cf0._4_2_;
      sStack_d0a = uStack_ce0._6_2_ + uStack_cf0._6_2_;
      local_d08._0_2_ = (short)lVar58;
      local_d08._2_2_ = (short)((ulong)lVar58 >> 0x10);
      local_d08._4_2_ = (short)((ulong)lVar58 >> 0x20);
      local_d08._6_2_ = (short)((ulong)lVar58 >> 0x30);
      uStack_d00._0_2_ = (short)lVar59;
      uStack_d00._2_2_ = (short)((ulong)lVar59 >> 0x10);
      uStack_d00._4_2_ = (short)((ulong)lVar59 >> 0x20);
      uStack_d00._6_2_ = (short)((ulong)lVar59 >> 0x30);
      local_d38 = (short)local_d08 + (short)local_ce8 + (short)local_cf8;
      sStack_d36 = local_d08._2_2_ + local_ce8._2_2_ + local_cf8._2_2_;
      sStack_d34 = local_d08._4_2_ + local_ce8._4_2_ + local_cf8._4_2_;
      sStack_d32 = local_d08._6_2_ + local_ce8._6_2_ + local_cf8._6_2_;
      sStack_d30 = (short)uStack_d00 + (short)uStack_ce0 + (short)uStack_cf0;
      sStack_d2e = uStack_d00._2_2_ + uStack_ce0._2_2_ + uStack_cf0._2_2_;
      sStack_d2c = uStack_d00._4_2_ + uStack_ce0._4_2_ + uStack_cf0._4_2_;
      sStack_d2a = uStack_d00._6_2_ + uStack_ce0._6_2_ + uStack_cf0._6_2_;
      local_d28 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
      uStack_d20 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
      sVar151 = local_1848 + local_d38;
      sVar157 = sStack_1846 + sStack_d36;
      sVar158 = sStack_1844 + sStack_d34;
      sVar159 = sStack_1842 + sStack_d32;
      sVar160 = sStack_1840 + sStack_d30;
      sVar161 = sStack_183e + sStack_d2e;
      sVar162 = sStack_183c + sStack_d2c;
      sVar163 = sStack_183a + sStack_d2a;
      local_d48 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_d40 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      local_d58 = CONCAT26(sVar159,CONCAT24(sVar158,CONCAT22(sVar157,sVar151)));
      uStack_d50 = CONCAT26(sVar163,CONCAT24(sVar162,CONCAT22(sVar161,sVar160)));
      local_1758 = local_18c8 + sVar151;
      uStack_1756 = sStack_18c6 + sVar157;
      uStack_1754 = sStack_18c4 + sVar158;
      uStack_1752 = sStack_18c2 + sVar159;
      sStack_1750 = sStack_18c0 + sVar160;
      sStack_174e = sStack_18be + sVar161;
      sStack_174c = sStack_18bc + sVar162;
      sStack_174a = sStack_18ba + sVar163;
      local_d68 = local_18f8;
      uStack_d60 = uStack_18f0;
      local_d78 = CONCAT26(sVar163,CONCAT24(sVar162,CONCAT22(sVar161,sVar160)));
      uStack_d70 = 0;
      local_17b8 = (short)local_6f8 + sVar160;
      uStack_17b6 = local_6f8._2_2_ + sVar161;
      uStack_17b4 = local_6f8._4_2_ + sVar162;
      uStack_17b2 = local_6f8._6_2_ + sVar163;
      local_668 = CONCAT26(uStack_1752,CONCAT24(uStack_1754,CONCAT22(uStack_1756,local_1758)));
      uStack_660 = CONCAT26(uStack_17b2,CONCAT24(uStack_17b4,CONCAT22(uStack_17b6,local_17b8)));
      local_1388 = local_668;
      uStack_1380 = CONCAT26(sStack_18ba + sVar163,
                             CONCAT24(sStack_18bc + sVar162,
                                      CONCAT22(sStack_18be + sVar161,sStack_18c0 + sVar160)));
      local_1398 = uStack_660;
      uStack_1390 = CONCAT26(sStack_17aa,CONCAT24(sStack_17ac,CONCAT22(sStack_17ae,sStack_17b0)));
      local_66c = 4;
      local_1818 = local_1758 >> 4;
      uStack_1816 = uStack_1756 >> 4;
      uStack_1814 = uStack_1754 >> 4;
      uStack_1812 = uStack_1752 >> 4;
      uStack_1810 = local_17b8 >> 4;
      uStack_180e = uStack_17b6 >> 4;
      uStack_180c = uStack_17b4 >> 4;
      uStack_180a = uStack_17b2 >> 4;
      lVar56 = local_1580[0xc];
      lVar57 = local_1580[0xd];
      local_d88 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
      uStack_d80 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
      local_d98 = lVar56;
      lVar106 = local_d98;
      uStack_d90 = lVar57;
      lVar107 = uStack_d90;
      local_d98._0_2_ = (short)lVar56;
      local_d98._2_2_ = (short)((ulong)lVar56 >> 0x10);
      local_d98._4_2_ = (short)((ulong)lVar56 >> 0x20);
      local_d98._6_2_ = (short)((ulong)lVar56 >> 0x30);
      uStack_d90._0_2_ = (short)lVar57;
      uStack_d90._2_2_ = (short)((ulong)lVar57 >> 0x10);
      uStack_d90._4_2_ = (short)((ulong)lVar57 >> 0x20);
      uStack_d90._6_2_ = (short)((ulong)lVar57 >> 0x30);
      local_1848 = local_1848 + (short)local_d98;
      sStack_1846 = sStack_1846 + local_d98._2_2_;
      sStack_1844 = sStack_1844 + local_d98._4_2_;
      sStack_1842 = sStack_1842 + local_d98._6_2_;
      sStack_1840 = sStack_1840 + (short)uStack_d90;
      sStack_183e = sStack_183e + uStack_d90._2_2_;
      sStack_183c = sStack_183c + uStack_d90._4_2_;
      sStack_183a = sStack_183a + uStack_d90._6_2_;
      local_7e8 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_7e0 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      lVar56 = local_1578[3][0];
      lVar57 = local_1578[3][1];
      local_7f8._0_2_ = (short)lVar56;
      local_7f8._2_2_ = (short)((ulong)lVar56 >> 0x10);
      local_7f8._4_2_ = (short)((ulong)lVar56 >> 0x20);
      local_7f8._6_2_ = (short)((ulong)lVar56 >> 0x30);
      uStack_7f0._0_2_ = (short)lVar57;
      uStack_7f0._2_2_ = (short)((ulong)lVar57 >> 0x10);
      uStack_7f0._4_2_ = (short)((ulong)lVar57 >> 0x20);
      uStack_7f0._6_2_ = (short)((ulong)lVar57 >> 0x30);
      local_18c8 = local_18c8 - (short)local_7f8;
      sStack_18c6 = sStack_18c6 - local_7f8._2_2_;
      sStack_18c4 = sStack_18c4 - local_7f8._4_2_;
      sStack_18c2 = sStack_18c2 - local_7f8._6_2_;
      sStack_18c0 = sStack_18c0 - (short)uStack_7f0;
      sStack_18be = sStack_18be - uStack_7f0._2_2_;
      sStack_18bc = sStack_18bc - uStack_7f0._4_2_;
      sStack_18ba = sStack_18ba - uStack_7f0._6_2_;
      lVar58 = local_1580[6];
      lVar59 = local_1580[7];
      local_808 = local_18f8;
      uStack_800 = uStack_18f0;
      local_818._0_2_ = (short)lVar58;
      local_818._2_2_ = (short)((ulong)lVar58 >> 0x10);
      local_818._4_2_ = (short)((ulong)lVar58 >> 0x20);
      local_818._6_2_ = (short)((ulong)lVar58 >> 0x30);
      uStack_810._0_2_ = (short)lVar59;
      uStack_810._2_2_ = (short)((ulong)lVar59 >> 0x10);
      uStack_810._4_2_ = (short)((ulong)lVar59 >> 0x20);
      uStack_810._6_2_ = (short)((ulong)lVar59 >> 0x30);
      local_6f8._0_2_ = (short)local_6f8 - (short)local_818;
      local_6f8._2_2_ = local_6f8._2_2_ - local_818._2_2_;
      local_6f8._4_2_ = local_6f8._4_2_ - local_818._4_2_;
      local_6f8._6_2_ = local_6f8._6_2_ - local_818._6_2_;
      sStack_17a0 = sStack_17b0 - (short)uStack_810;
      sStack_179e = sStack_17ae - uStack_810._2_2_;
      sStack_179c = sStack_17ac - uStack_810._4_2_;
      sStack_179a = sStack_17aa - uStack_810._6_2_;
      local_18f8._0_4_ = CONCAT22(local_6f8._2_2_,(short)local_6f8);
      local_18f8._0_6_ = CONCAT24(local_6f8._4_2_,(undefined4)local_18f8);
      local_18f8 = CONCAT26(local_6f8._6_2_,(undefined6)local_18f8);
      uStack_18f0._0_4_ = CONCAT22(sStack_179e,sStack_17a0);
      uStack_18f0._0_6_ = CONCAT24(sStack_179c,(undefined4)uStack_18f0);
      uStack_18f0 = CONCAT26(sStack_179a,(undefined6)uStack_18f0);
      lVar60 = local_1580[4];
      lVar61 = local_1580[5];
      lVar62 = local_1580[6];
      lVar63 = local_1580[7];
      lVar64 = local_1580[8];
      lVar65 = local_1580[9];
      local_da8 = lVar64;
      lVar104 = local_da8;
      uStack_da0 = lVar65;
      lVar105 = uStack_da0;
      local_db8 = lVar60;
      lVar102 = local_db8;
      uStack_db0 = lVar61;
      lVar103 = uStack_db0;
      local_da8._0_2_ = (short)lVar64;
      local_da8._2_2_ = (short)((ulong)lVar64 >> 0x10);
      local_da8._4_2_ = (short)((ulong)lVar64 >> 0x20);
      local_da8._6_2_ = (short)((ulong)lVar64 >> 0x30);
      uStack_da0._0_2_ = (short)lVar65;
      uStack_da0._2_2_ = (short)((ulong)lVar65 >> 0x10);
      uStack_da0._4_2_ = (short)((ulong)lVar65 >> 0x20);
      uStack_da0._6_2_ = (short)((ulong)lVar65 >> 0x30);
      local_db8._0_2_ = (short)lVar60;
      local_db8._2_2_ = (short)((ulong)lVar60 >> 0x10);
      local_db8._4_2_ = (short)((ulong)lVar60 >> 0x20);
      local_db8._6_2_ = (short)((ulong)lVar60 >> 0x30);
      uStack_db0._0_2_ = (short)lVar61;
      uStack_db0._2_2_ = (short)((ulong)lVar61 >> 0x10);
      uStack_db0._4_2_ = (short)((ulong)lVar61 >> 0x20);
      uStack_db0._6_2_ = (short)((ulong)lVar61 >> 0x30);
      local_dc8 = lVar62;
      lVar100 = local_dc8;
      uStack_dc0 = lVar63;
      lVar101 = uStack_dc0;
      local_dd8 = (short)local_da8 + (short)local_db8;
      sStack_dd6 = local_da8._2_2_ + local_db8._2_2_;
      sStack_dd4 = local_da8._4_2_ + local_db8._4_2_;
      sStack_dd2 = local_da8._6_2_ + local_db8._6_2_;
      sStack_dd0 = (short)uStack_da0 + (short)uStack_db0;
      sStack_dce = uStack_da0._2_2_ + uStack_db0._2_2_;
      sStack_dcc = uStack_da0._4_2_ + uStack_db0._4_2_;
      sStack_dca = uStack_da0._6_2_ + uStack_db0._6_2_;
      local_dc8._0_2_ = (short)lVar62;
      local_dc8._2_2_ = (short)((ulong)lVar62 >> 0x10);
      local_dc8._4_2_ = (short)((ulong)lVar62 >> 0x20);
      local_dc8._6_2_ = (short)((ulong)lVar62 >> 0x30);
      uStack_dc0._0_2_ = (short)lVar63;
      uStack_dc0._2_2_ = (short)((ulong)lVar63 >> 0x10);
      uStack_dc0._4_2_ = (short)((ulong)lVar63 >> 0x20);
      uStack_dc0._6_2_ = (short)((ulong)lVar63 >> 0x30);
      local_df8 = (short)local_dc8 + (short)local_da8 + (short)local_db8;
      sStack_df6 = local_dc8._2_2_ + local_da8._2_2_ + local_db8._2_2_;
      sStack_df4 = local_dc8._4_2_ + local_da8._4_2_ + local_db8._4_2_;
      sStack_df2 = local_dc8._6_2_ + local_da8._6_2_ + local_db8._6_2_;
      sStack_df0 = (short)uStack_dc0 + (short)uStack_da0 + (short)uStack_db0;
      sStack_dee = uStack_dc0._2_2_ + uStack_da0._2_2_ + uStack_db0._2_2_;
      sStack_dec = uStack_dc0._4_2_ + uStack_da0._4_2_ + uStack_db0._4_2_;
      sStack_dea = uStack_dc0._6_2_ + uStack_da0._6_2_ + uStack_db0._6_2_;
      local_de8 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
      uStack_de0 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
      sVar151 = local_1848 + local_df8;
      sVar157 = sStack_1846 + sStack_df6;
      sVar158 = sStack_1844 + sStack_df4;
      sVar159 = sStack_1842 + sStack_df2;
      sVar160 = sStack_1840 + sStack_df0;
      sVar161 = sStack_183e + sStack_dee;
      sVar162 = sStack_183c + sStack_dec;
      sVar163 = sStack_183a + sStack_dea;
      local_e08 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_e00 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      local_e18 = CONCAT26(sVar159,CONCAT24(sVar158,CONCAT22(sVar157,sVar151)));
      uStack_e10 = CONCAT26(sVar163,CONCAT24(sVar162,CONCAT22(sVar161,sVar160)));
      local_1748 = local_18c8 + sVar151;
      uStack_1746 = sStack_18c6 + sVar157;
      uStack_1744 = sStack_18c4 + sVar158;
      uStack_1742 = sStack_18c2 + sVar159;
      sStack_1740 = sStack_18c0 + sVar160;
      sStack_173e = sStack_18be + sVar161;
      sStack_173c = sStack_18bc + sVar162;
      sStack_173a = sStack_18ba + sVar163;
      local_e28 = local_18f8;
      uStack_e20 = uStack_18f0;
      local_e38 = CONCAT26(sVar163,CONCAT24(sVar162,CONCAT22(sVar161,sVar160)));
      uStack_e30 = 0;
      local_17a8 = (short)local_6f8 + sVar160;
      uStack_17a6 = local_6f8._2_2_ + sVar161;
      uStack_17a4 = local_6f8._4_2_ + sVar162;
      uStack_17a2 = local_6f8._6_2_ + sVar163;
      local_688 = CONCAT26(uStack_1742,CONCAT24(uStack_1744,CONCAT22(uStack_1746,local_1748)));
      uStack_680 = CONCAT26(uStack_17a2,CONCAT24(uStack_17a4,CONCAT22(uStack_17a6,local_17a8)));
      local_13a8 = local_688;
      uStack_13a0 = CONCAT26(sStack_18ba + sVar163,
                             CONCAT24(sStack_18bc + sVar162,
                                      CONCAT22(sStack_18be + sVar161,sStack_18c0 + sVar160)));
      local_13b8 = uStack_680;
      uStack_13b0 = CONCAT26(sStack_179a,CONCAT24(sStack_179c,CONCAT22(sStack_179e,sStack_17a0)));
      local_68c = 4;
      local_1808 = local_1748 >> 4;
      uStack_1806 = uStack_1746 >> 4;
      uStack_1804 = uStack_1744 >> 4;
      uStack_1802 = uStack_1742 >> 4;
      uStack_1800 = local_17a8 >> 4;
      uStack_17fe = uStack_17a6 >> 4;
      uStack_17fc = uStack_17a4 >> 4;
      uStack_17fa = uStack_17a2 >> 4;
      lVar60 = local_1580[0xc];
      lVar61 = local_1580[0xd];
      local_e48 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
      uStack_e40 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
      local_e58 = lVar60;
      lVar98 = local_e58;
      uStack_e50 = lVar61;
      lVar99 = uStack_e50;
      local_e58._0_2_ = (short)lVar60;
      local_e58._2_2_ = (short)((ulong)lVar60 >> 0x10);
      local_e58._4_2_ = (short)((ulong)lVar60 >> 0x20);
      local_e58._6_2_ = (short)((ulong)lVar60 >> 0x30);
      uStack_e50._0_2_ = (short)lVar61;
      uStack_e50._2_2_ = (short)((ulong)lVar61 >> 0x10);
      uStack_e50._4_2_ = (short)((ulong)lVar61 >> 0x20);
      uStack_e50._6_2_ = (short)((ulong)lVar61 >> 0x30);
      local_1848 = local_1848 + (short)local_e58;
      sStack_1846 = sStack_1846 + local_e58._2_2_;
      sStack_1844 = sStack_1844 + local_e58._4_2_;
      sStack_1842 = sStack_1842 + local_e58._6_2_;
      sStack_1840 = sStack_1840 + (short)uStack_e50;
      sStack_183e = sStack_183e + uStack_e50._2_2_;
      sStack_183c = sStack_183c + uStack_e50._4_2_;
      sStack_183a = sStack_183a + uStack_e50._6_2_;
      local_828 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_820 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      lVar60 = local_1578[2][0];
      lVar61 = local_1578[2][1];
      local_838._0_2_ = (short)lVar60;
      local_838._2_2_ = (short)((ulong)lVar60 >> 0x10);
      local_838._4_2_ = (short)((ulong)lVar60 >> 0x20);
      local_838._6_2_ = (short)((ulong)lVar60 >> 0x30);
      uStack_830._0_2_ = (short)lVar61;
      uStack_830._2_2_ = (short)((ulong)lVar61 >> 0x10);
      uStack_830._4_2_ = (short)((ulong)lVar61 >> 0x20);
      uStack_830._6_2_ = (short)((ulong)lVar61 >> 0x30);
      local_18c8 = local_18c8 - (short)local_838;
      sStack_18c6 = sStack_18c6 - local_838._2_2_;
      sStack_18c4 = sStack_18c4 - local_838._4_2_;
      sStack_18c2 = sStack_18c2 - local_838._6_2_;
      sStack_18c0 = sStack_18c0 - (short)uStack_830;
      sStack_18be = sStack_18be - uStack_830._2_2_;
      sStack_18bc = sStack_18bc - uStack_830._4_2_;
      sStack_18ba = sStack_18ba - uStack_830._6_2_;
      lVar62 = local_1580[4];
      lVar63 = local_1580[5];
      local_848 = local_18f8;
      uStack_840 = uStack_18f0;
      local_858._0_2_ = (short)lVar62;
      local_858._2_2_ = (short)((ulong)lVar62 >> 0x10);
      local_858._4_2_ = (short)((ulong)lVar62 >> 0x20);
      local_858._6_2_ = (short)((ulong)lVar62 >> 0x30);
      uStack_850._0_2_ = (short)lVar63;
      uStack_850._2_2_ = (short)((ulong)lVar63 >> 0x10);
      uStack_850._4_2_ = (short)((ulong)lVar63 >> 0x20);
      uStack_850._6_2_ = (short)((ulong)lVar63 >> 0x30);
      local_6f8._0_2_ = (short)local_6f8 - (short)local_858;
      local_6f8._2_2_ = local_6f8._2_2_ - local_858._2_2_;
      local_6f8._4_2_ = local_6f8._4_2_ - local_858._4_2_;
      local_6f8._6_2_ = local_6f8._6_2_ - local_858._6_2_;
      sStack_1790 = sStack_17a0 - (short)uStack_850;
      sStack_178e = sStack_179e - uStack_850._2_2_;
      sStack_178c = sStack_179c - uStack_850._4_2_;
      sStack_178a = sStack_179a - uStack_850._6_2_;
      local_18f8._0_4_ = CONCAT22(local_6f8._2_2_,(short)local_6f8);
      local_18f8._0_6_ = CONCAT24(local_6f8._4_2_,(undefined4)local_18f8);
      local_18f8 = CONCAT26(local_6f8._6_2_,(undefined6)local_18f8);
      uStack_18f0._0_4_ = CONCAT22(sStack_178e,sStack_1790);
      uStack_18f0._0_6_ = CONCAT24(sStack_178c,(undefined4)uStack_18f0);
      uStack_18f0 = CONCAT26(sStack_178a,(undefined6)uStack_18f0);
      lVar64 = local_1580[6];
      lVar65 = local_1580[7];
      lVar66 = local_1580[8];
      lVar67 = local_1580[9];
      lVar68 = local_1580[10];
      lVar69 = local_1580[0xb];
      local_e68 = lVar68;
      lVar96 = local_e68;
      uStack_e60 = lVar69;
      lVar97 = uStack_e60;
      local_e78 = lVar64;
      lVar94 = local_e78;
      uStack_e70 = lVar65;
      lVar95 = uStack_e70;
      local_e68._0_2_ = (short)lVar68;
      local_e68._2_2_ = (short)((ulong)lVar68 >> 0x10);
      local_e68._4_2_ = (short)((ulong)lVar68 >> 0x20);
      local_e68._6_2_ = (short)((ulong)lVar68 >> 0x30);
      uStack_e60._0_2_ = (short)lVar69;
      uStack_e60._2_2_ = (short)((ulong)lVar69 >> 0x10);
      uStack_e60._4_2_ = (short)((ulong)lVar69 >> 0x20);
      uStack_e60._6_2_ = (short)((ulong)lVar69 >> 0x30);
      local_e78._0_2_ = (short)lVar64;
      local_e78._2_2_ = (short)((ulong)lVar64 >> 0x10);
      local_e78._4_2_ = (short)((ulong)lVar64 >> 0x20);
      local_e78._6_2_ = (short)((ulong)lVar64 >> 0x30);
      uStack_e70._0_2_ = (short)lVar65;
      uStack_e70._2_2_ = (short)((ulong)lVar65 >> 0x10);
      uStack_e70._4_2_ = (short)((ulong)lVar65 >> 0x20);
      uStack_e70._6_2_ = (short)((ulong)lVar65 >> 0x30);
      local_e88 = lVar66;
      lVar92 = local_e88;
      uStack_e80 = lVar67;
      lVar93 = uStack_e80;
      local_e98 = (short)local_e68 + (short)local_e78;
      sStack_e96 = local_e68._2_2_ + local_e78._2_2_;
      sStack_e94 = local_e68._4_2_ + local_e78._4_2_;
      sStack_e92 = local_e68._6_2_ + local_e78._6_2_;
      sStack_e90 = (short)uStack_e60 + (short)uStack_e70;
      sStack_e8e = uStack_e60._2_2_ + uStack_e70._2_2_;
      sStack_e8c = uStack_e60._4_2_ + uStack_e70._4_2_;
      sStack_e8a = uStack_e60._6_2_ + uStack_e70._6_2_;
      local_e88._0_2_ = (short)lVar66;
      local_e88._2_2_ = (short)((ulong)lVar66 >> 0x10);
      local_e88._4_2_ = (short)((ulong)lVar66 >> 0x20);
      local_e88._6_2_ = (short)((ulong)lVar66 >> 0x30);
      uStack_e80._0_2_ = (short)lVar67;
      uStack_e80._2_2_ = (short)((ulong)lVar67 >> 0x10);
      uStack_e80._4_2_ = (short)((ulong)lVar67 >> 0x20);
      uStack_e80._6_2_ = (short)((ulong)lVar67 >> 0x30);
      local_eb8 = (short)local_e88 + (short)local_e68 + (short)local_e78;
      sStack_eb6 = local_e88._2_2_ + local_e68._2_2_ + local_e78._2_2_;
      sStack_eb4 = local_e88._4_2_ + local_e68._4_2_ + local_e78._4_2_;
      sStack_eb2 = local_e88._6_2_ + local_e68._6_2_ + local_e78._6_2_;
      sStack_eb0 = (short)uStack_e80 + (short)uStack_e60 + (short)uStack_e70;
      sStack_eae = uStack_e80._2_2_ + uStack_e60._2_2_ + uStack_e70._2_2_;
      sStack_eac = uStack_e80._4_2_ + uStack_e60._4_2_ + uStack_e70._4_2_;
      sStack_eaa = uStack_e80._6_2_ + uStack_e60._6_2_ + uStack_e70._6_2_;
      local_ea8 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
      uStack_ea0 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
      sVar151 = local_1848 + local_eb8;
      sVar157 = sStack_1846 + sStack_eb6;
      sVar158 = sStack_1844 + sStack_eb4;
      sVar159 = sStack_1842 + sStack_eb2;
      sVar160 = sStack_1840 + sStack_eb0;
      sVar161 = sStack_183e + sStack_eae;
      sVar162 = sStack_183c + sStack_eac;
      sVar163 = sStack_183a + sStack_eaa;
      local_ec8 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_ec0 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      local_ed8 = CONCAT26(sVar159,CONCAT24(sVar158,CONCAT22(sVar157,sVar151)));
      uStack_ed0 = CONCAT26(sVar163,CONCAT24(sVar162,CONCAT22(sVar161,sVar160)));
      local_1738 = local_18c8 + sVar151;
      uStack_1736 = sStack_18c6 + sVar157;
      uStack_1734 = sStack_18c4 + sVar158;
      uStack_1732 = sStack_18c2 + sVar159;
      local_ee8 = local_18f8;
      uStack_ee0 = uStack_18f0;
      local_ef8 = CONCAT26(sVar163,CONCAT24(sVar162,CONCAT22(sVar161,sVar160)));
      uStack_ef0 = 0;
      local_1798 = (short)local_6f8 + sVar160;
      uStack_1796 = local_6f8._2_2_ + sVar161;
      uStack_1794 = local_6f8._4_2_ + sVar162;
      uStack_1792 = local_6f8._6_2_ + sVar163;
      local_6a8 = CONCAT26(uStack_1732,CONCAT24(uStack_1734,CONCAT22(uStack_1736,local_1738)));
      uStack_6a0 = CONCAT26(uStack_1792,CONCAT24(uStack_1794,CONCAT22(uStack_1796,local_1798)));
      local_13c8 = local_6a8;
      uStack_13c0 = CONCAT26(sStack_18ba + sVar163,
                             CONCAT24(sStack_18bc + sVar162,
                                      CONCAT22(sStack_18be + sVar161,sStack_18c0 + sVar160)));
      local_13d8 = uStack_6a0;
      uStack_13d0 = CONCAT26(sStack_178a,CONCAT24(sStack_178c,CONCAT22(sStack_178e,sStack_1790)));
      local_6ac = 4;
      local_17f8 = local_1738 >> 4;
      uStack_17f6 = uStack_1736 >> 4;
      uStack_17f4 = uStack_1734 >> 4;
      uStack_17f2 = uStack_1732 >> 4;
      uStack_17f0 = local_1798 >> 4;
      uStack_17ee = uStack_1796 >> 4;
      uStack_17ec = uStack_1794 >> 4;
      uStack_17ea = uStack_1792 >> 4;
      lVar64 = local_1580[0xc];
      lVar65 = local_1580[0xd];
      local_f08 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
      uStack_f00 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
      local_f18 = lVar64;
      lVar90 = local_f18;
      uStack_f10 = lVar65;
      lVar91 = uStack_f10;
      local_f18._0_2_ = (short)lVar64;
      local_f18._2_2_ = (short)((ulong)lVar64 >> 0x10);
      local_f18._4_2_ = (short)((ulong)lVar64 >> 0x20);
      local_f18._6_2_ = (short)((ulong)lVar64 >> 0x30);
      uStack_f10._0_2_ = (short)lVar65;
      uStack_f10._2_2_ = (short)((ulong)lVar65 >> 0x10);
      uStack_f10._4_2_ = (short)((ulong)lVar65 >> 0x20);
      uStack_f10._6_2_ = (short)((ulong)lVar65 >> 0x30);
      local_1848 = local_1848 + (short)local_f18;
      sStack_1846 = sStack_1846 + local_f18._2_2_;
      sStack_1844 = sStack_1844 + local_f18._4_2_;
      sStack_1842 = sStack_1842 + local_f18._6_2_;
      sStack_1840 = sStack_1840 + (short)uStack_f10;
      sStack_183e = sStack_183e + uStack_f10._2_2_;
      sStack_183c = sStack_183c + uStack_f10._4_2_;
      sStack_183a = sStack_183a + uStack_f10._6_2_;
      local_868 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_860 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      lVar64 = local_1578[1][0];
      lVar65 = local_1578[1][1];
      local_878._0_2_ = (short)lVar64;
      local_878._2_2_ = (short)((ulong)lVar64 >> 0x10);
      local_878._4_2_ = (short)((ulong)lVar64 >> 0x20);
      local_878._6_2_ = (short)((ulong)lVar64 >> 0x30);
      uStack_870._0_2_ = (short)lVar65;
      uStack_870._2_2_ = (short)((ulong)lVar65 >> 0x10);
      uStack_870._4_2_ = (short)((ulong)lVar65 >> 0x20);
      uStack_870._6_2_ = (short)((ulong)lVar65 >> 0x30);
      local_18c8 = local_18c8 - (short)local_878;
      sStack_18c6 = sStack_18c6 - local_878._2_2_;
      sStack_18c4 = sStack_18c4 - local_878._4_2_;
      sStack_18c2 = sStack_18c2 - local_878._6_2_;
      sStack_18c0 = sStack_18c0 - (short)uStack_870;
      sStack_18be = sStack_18be - uStack_870._2_2_;
      sStack_18bc = sStack_18bc - uStack_870._4_2_;
      sStack_18ba = sStack_18ba - uStack_870._6_2_;
      lVar66 = local_1580[2];
      lVar67 = local_1580[3];
      local_888 = local_18f8;
      uStack_880 = uStack_18f0;
      local_898._0_2_ = (short)lVar66;
      local_898._2_2_ = (short)((ulong)lVar66 >> 0x10);
      local_898._4_2_ = (short)((ulong)lVar66 >> 0x20);
      local_898._6_2_ = (short)((ulong)lVar66 >> 0x30);
      uStack_890._0_2_ = (short)lVar67;
      uStack_890._2_2_ = (short)((ulong)lVar67 >> 0x10);
      uStack_890._4_2_ = (short)((ulong)lVar67 >> 0x20);
      uStack_890._6_2_ = (short)((ulong)lVar67 >> 0x30);
      sStack_1780 = sStack_1790 - (short)uStack_890;
      sStack_177e = sStack_178e - uStack_890._2_2_;
      sStack_177c = sStack_178c - uStack_890._4_2_;
      sStack_177a = sStack_178a - uStack_890._6_2_;
      local_18f8._0_4_ =
           CONCAT22(local_6f8._2_2_ - local_898._2_2_,(short)local_6f8 - (short)local_898);
      local_18f8._0_6_ = CONCAT24(local_6f8._4_2_ - local_898._4_2_,(undefined4)local_18f8);
      local_18f8 = CONCAT26(local_6f8._6_2_ - local_898._6_2_,(undefined6)local_18f8);
      uStack_18f0._0_4_ = CONCAT22(sStack_177e,sStack_1780);
      uStack_18f0._0_6_ = CONCAT24(sStack_177c,(undefined4)uStack_18f0);
      uStack_18f0 = CONCAT26(sStack_177a,(undefined6)uStack_18f0);
      lVar68 = local_1580[8];
      lVar69 = local_1580[9];
      lVar70 = local_1580[10];
      lVar71 = local_1580[0xb];
      lVar72 = local_1580[0xc];
      lVar73 = local_1580[0xd];
      local_f28 = lVar72;
      lVar72 = local_f28;
      uStack_f20 = lVar73;
      lVar73 = uStack_f20;
      local_f38 = lVar68;
      lVar88 = local_f38;
      uStack_f30 = lVar69;
      lVar89 = uStack_f30;
      local_f28._0_2_ = (short)lVar72;
      local_f28._2_2_ = (short)((ulong)lVar72 >> 0x10);
      local_f28._4_2_ = (short)((ulong)lVar72 >> 0x20);
      local_f28._6_2_ = (short)((ulong)lVar72 >> 0x30);
      uStack_f20._0_2_ = (short)lVar73;
      uStack_f20._2_2_ = (short)((ulong)lVar73 >> 0x10);
      uStack_f20._4_2_ = (short)((ulong)lVar73 >> 0x20);
      uStack_f20._6_2_ = (short)((ulong)lVar73 >> 0x30);
      local_f38._0_2_ = (short)lVar68;
      local_f38._2_2_ = (short)((ulong)lVar68 >> 0x10);
      local_f38._4_2_ = (short)((ulong)lVar68 >> 0x20);
      local_f38._6_2_ = (short)((ulong)lVar68 >> 0x30);
      uStack_f30._0_2_ = (short)lVar69;
      uStack_f30._2_2_ = (short)((ulong)lVar69 >> 0x10);
      uStack_f30._4_2_ = (short)((ulong)lVar69 >> 0x20);
      uStack_f30._6_2_ = (short)((ulong)lVar69 >> 0x30);
      local_f48 = lVar70;
      lVar68 = local_f48;
      uStack_f40 = lVar71;
      lVar69 = uStack_f40;
      local_f58 = (short)local_f28 + (short)local_f38;
      sStack_f56 = local_f28._2_2_ + local_f38._2_2_;
      sStack_f54 = local_f28._4_2_ + local_f38._4_2_;
      sStack_f52 = local_f28._6_2_ + local_f38._6_2_;
      sStack_f50 = (short)uStack_f20 + (short)uStack_f30;
      sStack_f4e = uStack_f20._2_2_ + uStack_f30._2_2_;
      sStack_f4c = uStack_f20._4_2_ + uStack_f30._4_2_;
      sStack_f4a = uStack_f20._6_2_ + uStack_f30._6_2_;
      local_f48._0_2_ = (short)lVar70;
      local_f48._2_2_ = (short)((ulong)lVar70 >> 0x10);
      local_f48._4_2_ = (short)((ulong)lVar70 >> 0x20);
      local_f48._6_2_ = (short)((ulong)lVar70 >> 0x30);
      uStack_f40._0_2_ = (short)lVar71;
      uStack_f40._2_2_ = (short)((ulong)lVar71 >> 0x10);
      uStack_f40._4_2_ = (short)((ulong)lVar71 >> 0x20);
      uStack_f40._6_2_ = (short)((ulong)lVar71 >> 0x30);
      local_f78 = (short)local_f48 + (short)local_f28 + (short)local_f38;
      sStack_f76 = local_f48._2_2_ + local_f28._2_2_ + local_f38._2_2_;
      sStack_f74 = local_f48._4_2_ + local_f28._4_2_ + local_f38._4_2_;
      sStack_f72 = local_f48._6_2_ + local_f28._6_2_ + local_f38._6_2_;
      sStack_f70 = (short)uStack_f40 + (short)uStack_f20 + (short)uStack_f30;
      sStack_f6e = uStack_f40._2_2_ + uStack_f20._2_2_ + uStack_f30._2_2_;
      sStack_f6c = uStack_f40._4_2_ + uStack_f20._4_2_ + uStack_f30._4_2_;
      sStack_f6a = uStack_f40._6_2_ + uStack_f20._6_2_ + uStack_f30._6_2_;
      local_f68 = CONCAT26(sStack_1842,CONCAT24(sStack_1844,CONCAT22(sStack_1846,local_1848)));
      uStack_f60 = CONCAT26(sStack_183a,CONCAT24(sStack_183c,CONCAT22(sStack_183e,sStack_1840)));
      local_1888 = local_1848 + local_f78;
      sStack_1886 = sStack_1846 + sStack_f76;
      sStack_1884 = sStack_1844 + sStack_f74;
      sStack_1882 = sStack_1842 + sStack_f72;
      sStack_1880 = sStack_1840 + sStack_f70;
      sStack_187e = sStack_183e + sStack_f6e;
      sStack_187c = sStack_183c + sStack_f6c;
      sStack_187a = sStack_183a + sStack_f6a;
      local_f88 = CONCAT26(sStack_18c2,CONCAT24(sStack_18c4,CONCAT22(sStack_18c6,local_18c8)));
      uStack_f80 = CONCAT26(sStack_18ba,CONCAT24(sStack_18bc,CONCAT22(sStack_18be,sStack_18c0)));
      local_f98 = CONCAT26(sStack_1882,CONCAT24(sStack_1884,CONCAT22(sStack_1886,local_1888)));
      uStack_f90 = CONCAT26(sStack_187a,CONCAT24(sStack_187c,CONCAT22(sStack_187e,sStack_1880)));
      local_fa8 = local_18f8;
      uStack_fa0 = uStack_18f0;
      local_fb8 = CONCAT26(sStack_187a,CONCAT24(sStack_187c,CONCAT22(sStack_187e,sStack_1880)));
      uStack_fb0 = 0;
      local_1788 = ((short)local_6f8 - (short)local_898) + sStack_1880;
      uStack_1786 = (local_6f8._2_2_ - local_898._2_2_) + sStack_187e;
      uStack_1784 = (local_6f8._4_2_ - local_898._4_2_) + sStack_187c;
      uStack_1782 = (local_6f8._6_2_ - local_898._6_2_) + sStack_187a;
      local_6c8 = CONCAT26(sStack_18c2 + sStack_1882,
                           CONCAT24(sStack_18c4 + sStack_1884,
                                    CONCAT22(sStack_18c6 + sStack_1886,local_18c8 + local_1888)));
      uStack_6c0 = CONCAT26(uStack_1782,CONCAT24(uStack_1784,CONCAT22(uStack_1786,local_1788)));
      local_13e8 = local_6c8;
      uStack_13e0 = CONCAT26(sStack_18ba + sStack_187a,
                             CONCAT24(sStack_18bc + sStack_187c,
                                      CONCAT22(sStack_18be + sStack_187e,sStack_18c0 + sStack_1880))
                            );
      local_13f8 = uStack_6c0;
      uStack_13f0 = CONCAT26(sStack_177a,CONCAT24(sStack_177c,CONCAT22(sStack_177e,sStack_1780)));
      local_6cc = 4;
      local_17e8 = (ushort)(local_18c8 + local_1888) >> 4;
      uStack_17e6 = (ushort)(sStack_18c6 + sStack_1886) >> 4;
      uStack_17e4 = (ushort)(sStack_18c4 + sStack_1884) >> 4;
      uStack_17e2 = (ushort)(sStack_18c2 + sStack_1882) >> 4;
      uStack_17e0 = local_1788 >> 4;
      uStack_17de = uStack_1786 >> 4;
      uStack_17dc = uStack_1784 >> 4;
      uStack_17da = uStack_1782 >> 4;
      local_f48 = lVar68;
      uStack_f40 = lVar69;
      local_f38 = lVar88;
      uStack_f30 = lVar89;
      local_f28 = lVar72;
      uStack_f20 = lVar73;
      local_f18 = lVar90;
      uStack_f10 = lVar91;
      local_e88 = lVar92;
      uStack_e80 = lVar93;
      local_e78 = lVar94;
      uStack_e70 = lVar95;
      local_e68 = lVar96;
      uStack_e60 = lVar97;
      local_e58 = lVar98;
      uStack_e50 = lVar99;
      local_dc8 = lVar100;
      uStack_dc0 = lVar101;
      local_db8 = lVar102;
      uStack_db0 = lVar103;
      local_da8 = lVar104;
      uStack_da0 = lVar105;
      local_d98 = lVar106;
      uStack_d90 = lVar107;
      local_d08 = lVar108;
      uStack_d00 = lVar109;
      local_cf8 = lVar110;
      uStack_cf0 = lVar111;
      local_ce8 = lVar112;
      uStack_ce0 = lVar113;
      local_cd8 = lVar114;
      uStack_cd0 = lVar115;
      local_c58 = lVar116;
      uStack_c50 = lVar117;
      local_c18 = lVar118;
      uStack_c10 = lVar119;
      local_898 = lVar66;
      uStack_890 = lVar67;
      local_878 = lVar64;
      uStack_870 = lVar65;
      local_858 = lVar62;
      uStack_850 = lVar63;
      local_838 = lVar60;
      uStack_830 = lVar61;
      local_818 = lVar58;
      uStack_810 = lVar59;
      local_7f8 = lVar56;
      uStack_7f0 = lVar57;
      local_7d8 = lVar54;
      uStack_7d0 = lVar55;
      local_7b8 = lVar52;
      uStack_7b0 = lVar53;
    }
    local_1338 = local_1668;
    local_ff8 = uVar87;
    local_bb8 = lVar50;
    uStack_bb0 = lVar51;
    local_b98 = lVar120;
    uStack_b90 = lVar121;
    local_b38 = lVar122;
    uStack_b30 = lVar123;
    local_ae8 = lVar124;
    uStack_ae0 = lVar125;
    local_ad8 = lVar126;
    uStack_ad0 = lVar127;
    local_ac8 = lVar128;
    uStack_ac0 = lVar129;
    local_ab8 = lVar130;
    uStack_ab0 = lVar131;
    local_a98 = lVar132;
    uStack_a90 = lVar133;
    local_a88 = lVar134;
    uStack_a80 = lVar135;
    local_a68 = lVar136;
    uStack_a60 = lVar137;
    local_a48 = lVar138;
    uStack_a40 = lVar139;
    local_a18 = lVar140;
    uStack_a10 = lVar141;
    local_a08 = lVar142;
    uStack_a00 = lVar143;
    local_9d8 = lVar144;
    uStack_9d0 = lVar145;
    local_9c8 = lVar146;
    uStack_9c0 = lVar147;
    local_908 = lVar32;
    uStack_900 = lVar33;
    local_8f8 = lVar34;
    uStack_8f0 = lVar35;
    local_8e8 = lVar36;
    uStack_8e0 = lVar37;
    local_8c8 = lVar30;
    uStack_8c0 = lVar31;
    local_8b8 = lVar2;
    uStack_8b0 = lVar3;
    local_8a8 = lVar4;
    uStack_8a0 = lVar29;
    local_798 = lVar48;
    uStack_790 = lVar49;
    local_778 = lVar46;
    uStack_770 = lVar47;
    local_758 = lVar44;
    uStack_750 = lVar45;
    local_738 = lVar42;
    uStack_730 = lVar43;
    local_718 = lVar40;
    uStack_710 = lVar41;
    local_6f8 = lVar38;
    uStack_6f0 = lVar39;
    local_358 = local_968;
    uStack_350 = uStack_960;
    uStack_330 = uStack_9a0;
    *local_1580 = CONCAT44(uStack_1654,local_1658);
    plVar150[1] = lVar1;
    plVar150 = local_1580;
    uStack_57c = uStack_164c;
    local_578 = CONCAT44(local_578._4_4_,local_1648);
    local_598 = local_1668;
    uStack_58c = uStack_165c;
    *(undefined4 *)(local_1580 + 3) = uStack_580;
    *(undefined4 *)((long)plVar150 + 0x1c) = uStack_164c;
    *(undefined4 *)(plVar150 + 4) = uStack_590;
    *(undefined4 *)((long)plVar150 + 0x24) = uStack_165c;
    for (local_15a0 = 0; local_15a0 < 3; local_15a0 = local_15a0 + 1) {
      lVar1 = local_1580[(long)local_15a0 * 2];
      lVar2 = (local_1580 + (long)local_15a0 * 2)[1];
      local_528 = local_1678;
      uVar87 = local_528;
      uStack_520 = uStack_1670;
      uVar148 = uStack_520;
      local_528._0_4_ = (uint)local_1678;
      local_528._4_4_ = (uint)(local_1678 >> 0x20);
      uStack_520._0_4_ = (uint)uStack_1670;
      uStack_520._4_4_ = (uint)(uStack_1670 >> 0x20);
      local_538._0_4_ = (uint)lVar1;
      local_538._4_4_ = (uint)((ulong)lVar1 >> 0x20);
      uStack_530._0_4_ = (uint)lVar2;
      uStack_530._4_4_ = (uint)((ulong)lVar2 >> 0x20);
      puVar149 = (uint *)(local_1580 + (long)local_15a0 * 2);
      *puVar149 = ((uint)local_528 ^ 0xffffffff) & (uint)local_538;
      puVar149[1] = (local_528._4_4_ ^ 0xffffffff) & local_538._4_4_;
      puVar149[2] = ((uint)uStack_520 ^ 0xffffffff) & (uint)uStack_530;
      puVar149[3] = (uStack_520._4_4_ ^ 0xffffffff) & uStack_530._4_4_;
      uStack_10a0 = (&uStack_1710)[(long)local_15a0 * 2];
      local_1098 = local_1678;
      uStack_1090 = uStack_1670;
      local_10a8 = *(ulong *)(&stack0xffffffffffffe8e8 + (long)local_15a0 * 0x10);
      *(ulong *)(&stack0xffffffffffffe8e8 + (long)local_15a0 * 0x10) =
           local_1678 & *(ulong *)(&stack0xffffffffffffe8e8 + (long)local_15a0 * 0x10);
      (&uStack_1710)[(long)local_15a0 * 2] = uStack_1670 & uStack_10a0;
      local_4e8 = local_1580[(long)local_15a0 * 2];
      uStack_4e0 = (local_1580 + (long)local_15a0 * 2)[1];
      local_4f8 = *(ulong *)(&stack0xffffffffffffe8e8 + (long)local_15a0 * 0x10);
      uStack_4f0 = (&uStack_1710)[(long)local_15a0 * 2];
      local_1580[(long)local_15a0 * 2] = local_4e8 | local_4f8;
      (local_1580 + (long)local_15a0 * 2)[1] = uStack_4e0 | uStack_4f0;
      local_538 = lVar1;
      uStack_530 = lVar2;
      local_528 = uVar87;
      uStack_520 = uVar148;
    }
    if (local_18fc != 0) {
      for (local_15a0 = 0; local_15a0 < 6; local_15a0 = local_15a0 + 1) {
        lVar1 = local_1580[(long)local_15a0 * 2];
        lVar2 = (local_1580 + (long)local_15a0 * 2)[1];
        local_508 = local_1688;
        uVar87 = local_508;
        uStack_500 = uStack_1680;
        uVar148 = uStack_500;
        local_508._0_4_ = (uint)local_1688;
        local_508._4_4_ = (uint)(local_1688 >> 0x20);
        uStack_500._0_4_ = (uint)uStack_1680;
        uStack_500._4_4_ = (uint)(uStack_1680 >> 0x20);
        local_518._0_4_ = (uint)lVar1;
        local_518._4_4_ = (uint)((ulong)lVar1 >> 0x20);
        uStack_510._0_4_ = (uint)lVar2;
        uStack_510._4_4_ = (uint)((ulong)lVar2 >> 0x20);
        puVar149 = (uint *)(local_1580 + (long)local_15a0 * 2);
        *puVar149 = ((uint)local_508 ^ 0xffffffff) & (uint)local_518;
        puVar149[1] = (local_508._4_4_ ^ 0xffffffff) & local_518._4_4_;
        puVar149[2] = ((uint)uStack_500 ^ 0xffffffff) & (uint)uStack_510;
        puVar149[3] = (uStack_500._4_4_ ^ 0xffffffff) & uStack_510._4_4_;
        uStack_1080 = (&uStack_1830)[(long)local_15a0 * 2];
        local_1078 = local_1688;
        uStack_1070 = uStack_1680;
        local_1088 = (&local_1838)[(long)local_15a0 * 2];
        (&local_1838)[(long)local_15a0 * 2] = local_1688 & (&local_1838)[(long)local_15a0 * 2];
        (&uStack_1830)[(long)local_15a0 * 2] = uStack_1680 & uStack_1080;
        local_4c8 = local_1580[(long)local_15a0 * 2];
        uStack_4c0 = (local_1580 + (long)local_15a0 * 2)[1];
        local_4d8 = (&local_1838)[(long)local_15a0 * 2];
        uStack_4d0 = (&uStack_1830)[(long)local_15a0 * 2];
        local_1580[(long)local_15a0 * 2] = local_4c8 | local_4d8;
        (local_1580 + (long)local_15a0 * 2)[1] = uStack_4c0 | uStack_4d0;
        local_518 = lVar1;
        uStack_510 = lVar2;
        local_508 = uVar87;
        uStack_500 = uVar148;
      }
    }
  }
  highbd_transpose8x8_low_sse2
            ((__m128i *)&local_1b18,&local_19b8,(__m128i *)&local_1a38,(__m128i *)&local_1a48,
             (__m128i *)&local_1a58,(__m128i *)&local_1a68,(__m128i *)&local_1a78,
             (__m128i *)&local_1a88,(__m128i *)&local_1b18,(__m128i *)&local_1b28,
             (__m128i *)&local_1b38,(__m128i *)&local_1b48);
  local_19a8[0] = lStack_1a80;
  local_19a8[1] = 0;
  local_19a8[2] = lStack_1a70;
  uStack_1990 = 0;
  local_1988[0] = lStack_1a60;
  local_1988[1] = 0;
  local_1988[2] = lStack_1a50;
  uStack_1970 = 0;
  local_1968[0] = lStack_1a40;
  local_1968[1] = 0;
  local_1968[2] = lStack_1a30;
  uStack_1950 = 0;
  highbd_transpose8x8_low_sse2
            ((__m128i *)local_19a8,(__m128i *)(local_19a8 + 2),(__m128i *)local_1988,
             (__m128i *)(local_1988 + 2),(__m128i *)local_1968,(__m128i *)(local_1968 + 2),
             (__m128i *)local_1948,(__m128i *)&stack0xffffffffffffe468,(__m128i *)&local_1b58,
             (__m128i *)&local_1b68,(__m128i *)&local_1b78,(__m128i *)&local_1b88);
  local_1908[-2] = local_1b18;
  local_1908[-1] = lStack_1b10;
  *local_1908 = local_1b58;
  local_1908[1] = lStack_1b50;
  plVar150 = (longlong *)((long)local_1908 + (long)local_190c * 2 + -0x10);
  *plVar150 = local_1b28;
  plVar150[1] = lStack_1b20;
  plVar150 = (longlong *)((long)local_1908 + (long)local_190c * 2);
  *plVar150 = local_1b68;
  plVar150[1] = lStack_1b60;
  plVar150 = (longlong *)((long)local_1908 + (long)(local_190c << 1) * 2 + -0x10);
  *plVar150 = local_1b38;
  plVar150[1] = lStack_1b30;
  plVar150 = (longlong *)((long)local_1908 + (long)(local_190c << 1) * 2);
  *plVar150 = local_1b78;
  plVar150[1] = lStack_1b70;
  plVar150 = (longlong *)((long)local_1908 + (long)(local_190c * 3) * 2 + -0x10);
  *plVar150 = local_1b48;
  plVar150[1] = lStack_1b40;
  local_1908 = (longlong *)((long)local_1908 + (long)(local_190c * 3) * 2);
  *local_1908 = local_1b88;
  local_1908[1] = lStack_1b80;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_14_sse2(uint16_t *s, int pitch,
                                     const uint8_t *blimit,
                                     const uint8_t *limit,
                                     const uint8_t *thresh, int bd) {
  __m128i q[7], p[7], pq[7];
  __m128i p6, p5, p4, p3;
  __m128i p6_2, p5_2, p4_2, p3_2;
  __m128i d0, d1, d2, d3;
  __m128i d0_2, d1_2, d2_2, d3_2, d7_2;

  p6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * pitch));
  p5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * pitch));
  p4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * pitch));
  p3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * pitch));

  highbd_transpose4x8_8x4_sse2(&p6, &p5, &p4, &p3, &d0, &p[6], &p[5], &p[4],
                               &p[3], &p[2], &p[1], &p[0]);

  p6_2 = _mm_loadu_si128((__m128i *)(s + 0 * pitch));
  p5_2 = _mm_loadu_si128((__m128i *)(s + 1 * pitch));
  p4_2 = _mm_loadu_si128((__m128i *)(s + 2 * pitch));
  p3_2 = _mm_loadu_si128((__m128i *)(s + 3 * pitch));

  highbd_transpose4x8_8x4_sse2(&p6_2, &p5_2, &p4_2, &p3_2, &q[0], &q[1], &q[2],
                               &q[3], &q[4], &q[5], &q[6], &d7_2);

  highbd_lpf_internal_14_sse2(p, q, pq, blimit, limit, thresh, bd);

  highbd_transpose8x8_low_sse2(&d0, &p[6], &pq[5], &pq[4], &pq[3], &pq[2],
                               &pq[1], &pq[0], &d0, &d1, &d2, &d3);

  q[0] = _mm_srli_si128(pq[0], 8);
  q[1] = _mm_srli_si128(pq[1], 8);
  q[2] = _mm_srli_si128(pq[2], 8);
  q[3] = _mm_srli_si128(pq[3], 8);
  q[4] = _mm_srli_si128(pq[4], 8);
  q[5] = _mm_srli_si128(pq[5], 8);

  highbd_transpose8x8_low_sse2(&q[0], &q[1], &q[2], &q[3], &q[4], &q[5], &q[6],
                               &d7_2, &d0_2, &d1_2, &d2_2, &d3_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * pitch), d0);
  _mm_storeu_si128((__m128i *)(s + 0 * pitch), d0_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 1 * pitch), d1);
  _mm_storeu_si128((__m128i *)(s + 1 * pitch), d1_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 2 * pitch), d2);
  _mm_storeu_si128((__m128i *)(s + 2 * pitch), d2_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 3 * pitch), d3);
  _mm_storeu_si128((__m128i *)(s + 3 * pitch), d3_2);
}